

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  byte bVar61;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  bool bVar62;
  byte bVar63;
  uint uVar64;
  undefined1 uVar65;
  bool bVar66;
  undefined1 uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar78 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar135 [32];
  uint uVar142;
  float pp;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar221 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 auVar156 [64];
  float fVar157;
  undefined4 uVar158;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar166 [32];
  undefined1 auVar159 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [32];
  undefined1 auVar208 [16];
  undefined1 auVar215 [32];
  undefined1 auVar213 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar232 [32];
  undefined1 auVar229 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [28];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar249;
  undefined1 auVar248 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ab4;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  Primitive *local_6d0;
  ulong local_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  RTCHitN local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  
  PVar2 = prim[1];
  uVar58 = (ulong)(byte)PVar2;
  fVar203 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar77 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar79 = vsubps_avx(auVar72,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar202 = fVar203 * auVar79._0_4_;
  fVar143 = fVar203 * auVar77._0_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar58 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar72);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar58 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar14);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar58 * 6 + 6);
  auVar16 = vpmovsxbd_avx2(auVar70);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar73);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar94 = vpmovsxbd_avx2(auVar1);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar94);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar58 + 6);
  auVar87 = vpmovsxbd_avx2(auVar74);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar59 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar59 + 6);
  auVar91 = vpmovsxbd_avx2(auVar75);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar59 + uVar58 + 6);
  auVar92 = vpmovsxbd_avx2(auVar71);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar68 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar85 = vpmovsxbd_avx2(auVar76);
  auVar93 = vcvtdq2ps_avx(auVar85);
  auVar104._4_4_ = fVar143;
  auVar104._0_4_ = fVar143;
  auVar104._8_4_ = fVar143;
  auVar104._12_4_ = fVar143;
  auVar104._16_4_ = fVar143;
  auVar104._20_4_ = fVar143;
  auVar104._24_4_ = fVar143;
  auVar104._28_4_ = fVar143;
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  auVar83 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = ZEXT1632(CONCAT412(fVar203 * auVar77._12_4_,
                               CONCAT48(fVar203 * auVar77._8_4_,
                                        CONCAT44(fVar203 * auVar77._4_4_,fVar143))));
  auVar95 = vpermps_avx2(auVar106,auVar96);
  auVar84 = vpermps_avx512vl(auVar83,auVar96);
  fVar143 = auVar84._0_4_;
  fVar157 = auVar84._4_4_;
  auVar96._4_4_ = fVar157 * auVar16._4_4_;
  auVar96._0_4_ = fVar143 * auVar16._0_4_;
  fVar170 = auVar84._8_4_;
  auVar96._8_4_ = fVar170 * auVar16._8_4_;
  fVar171 = auVar84._12_4_;
  auVar96._12_4_ = fVar171 * auVar16._12_4_;
  fVar172 = auVar84._16_4_;
  auVar96._16_4_ = fVar172 * auVar16._16_4_;
  fVar174 = auVar84._20_4_;
  auVar96._20_4_ = fVar174 * auVar16._20_4_;
  fVar173 = auVar84._24_4_;
  auVar96._24_4_ = fVar173 * auVar16._24_4_;
  auVar96._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar87._4_4_ * fVar157;
  auVar94._0_4_ = auVar87._0_4_ * fVar143;
  auVar94._8_4_ = auVar87._8_4_ * fVar170;
  auVar94._12_4_ = auVar87._12_4_ * fVar171;
  auVar94._16_4_ = auVar87._16_4_ * fVar172;
  auVar94._20_4_ = auVar87._20_4_ * fVar174;
  auVar94._24_4_ = auVar87._24_4_ * fVar173;
  auVar94._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar93._4_4_ * fVar157;
  auVar85._0_4_ = auVar93._0_4_ * fVar143;
  auVar85._8_4_ = auVar93._8_4_ * fVar170;
  auVar85._12_4_ = auVar93._12_4_ * fVar171;
  auVar85._16_4_ = auVar93._16_4_ * fVar172;
  auVar85._20_4_ = auVar93._20_4_ * fVar174;
  auVar85._24_4_ = auVar93._24_4_ * fVar173;
  auVar85._28_4_ = auVar84._28_4_;
  auVar72 = vfmadd231ps_fma(auVar96,auVar95,auVar86);
  auVar14 = vfmadd231ps_fma(auVar94,auVar95,auVar90);
  auVar70 = vfmadd231ps_fma(auVar85,auVar92,auVar95);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar104,auVar88);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar104,auVar89);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar91,auVar104);
  auVar105._4_4_ = fVar202;
  auVar105._0_4_ = fVar202;
  auVar105._8_4_ = fVar202;
  auVar105._12_4_ = fVar202;
  auVar105._16_4_ = fVar202;
  auVar105._20_4_ = fVar202;
  auVar105._24_4_ = fVar202;
  auVar105._28_4_ = fVar202;
  auVar85 = ZEXT1632(CONCAT412(fVar203 * auVar79._12_4_,
                               CONCAT48(fVar203 * auVar79._8_4_,
                                        CONCAT44(fVar203 * auVar79._4_4_,fVar202))));
  auVar94 = vpermps_avx2(auVar106,auVar85);
  auVar85 = vpermps_avx512vl(auVar83,auVar85);
  fVar203 = auVar85._0_4_;
  fVar143 = auVar85._4_4_;
  auVar95._4_4_ = fVar143 * auVar16._4_4_;
  auVar95._0_4_ = fVar203 * auVar16._0_4_;
  fVar157 = auVar85._8_4_;
  auVar95._8_4_ = fVar157 * auVar16._8_4_;
  fVar170 = auVar85._12_4_;
  auVar95._12_4_ = fVar170 * auVar16._12_4_;
  fVar171 = auVar85._16_4_;
  auVar95._16_4_ = fVar171 * auVar16._16_4_;
  fVar172 = auVar85._20_4_;
  auVar95._20_4_ = fVar172 * auVar16._20_4_;
  fVar174 = auVar85._24_4_;
  auVar95._24_4_ = fVar174 * auVar16._24_4_;
  auVar95._28_4_ = 1;
  auVar83._4_4_ = auVar87._4_4_ * fVar143;
  auVar83._0_4_ = auVar87._0_4_ * fVar203;
  auVar83._8_4_ = auVar87._8_4_ * fVar157;
  auVar83._12_4_ = auVar87._12_4_ * fVar170;
  auVar83._16_4_ = auVar87._16_4_ * fVar171;
  auVar83._20_4_ = auVar87._20_4_ * fVar172;
  auVar83._24_4_ = auVar87._24_4_ * fVar174;
  auVar83._28_4_ = auVar16._28_4_;
  auVar87._4_4_ = auVar93._4_4_ * fVar143;
  auVar87._0_4_ = auVar93._0_4_ * fVar203;
  auVar87._8_4_ = auVar93._8_4_ * fVar157;
  auVar87._12_4_ = auVar93._12_4_ * fVar170;
  auVar87._16_4_ = auVar93._16_4_ * fVar171;
  auVar87._20_4_ = auVar93._20_4_ * fVar172;
  auVar87._24_4_ = auVar93._24_4_ * fVar174;
  auVar87._28_4_ = auVar85._28_4_;
  auVar73 = vfmadd231ps_fma(auVar95,auVar94,auVar86);
  auVar1 = vfmadd231ps_fma(auVar83,auVar94,auVar90);
  auVar74 = vfmadd231ps_fma(auVar87,auVar94,auVar92);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar105,auVar88);
  auVar248 = ZEXT1664(auVar73);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar105,auVar89);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar105,auVar91);
  auVar88 = vandps_avx(ZEXT1632(auVar72),auVar101);
  auVar103._8_4_ = 0x219392ef;
  auVar103._0_8_ = 0x219392ef219392ef;
  auVar103._12_4_ = 0x219392ef;
  auVar103._16_4_ = 0x219392ef;
  auVar103._20_4_ = 0x219392ef;
  auVar103._24_4_ = 0x219392ef;
  auVar103._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar88,auVar103,1);
  bVar62 = (bool)((byte)uVar59 & 1);
  auVar84._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._0_4_;
  bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._4_4_;
  bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._8_4_;
  bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar14),auVar101);
  uVar59 = vcmpps_avx512vl(auVar88,auVar103,1);
  bVar62 = (bool)((byte)uVar59 & 1);
  auVar97._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar14._0_4_;
  bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar14._4_4_;
  bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar14._8_4_;
  bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar14._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar70),auVar101);
  uVar59 = vcmpps_avx512vl(auVar88,auVar103,1);
  bVar62 = (bool)((byte)uVar59 & 1);
  auVar88._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._0_4_;
  bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._4_4_;
  bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._8_4_;
  bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar86 = vrcp14ps_avx512vl(auVar84);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = 0x3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar84,auVar86,auVar102);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar97);
  auVar14 = vfnmadd213ps_fma(auVar97,auVar86,auVar102);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar88);
  auVar70 = vfnmadd213ps_fma(auVar88,auVar86,auVar102);
  auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar86,auVar86);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar73));
  auVar91._4_4_ = auVar72._4_4_ * auVar88._4_4_;
  auVar91._0_4_ = auVar72._0_4_ * auVar88._0_4_;
  auVar91._8_4_ = auVar72._8_4_ * auVar88._8_4_;
  auVar91._12_4_ = auVar72._12_4_ * auVar88._12_4_;
  auVar91._16_4_ = auVar88._16_4_ * 0.0;
  auVar91._20_4_ = auVar88._20_4_ * 0.0;
  auVar91._24_4_ = auVar88._24_4_ * 0.0;
  auVar91._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar73));
  auVar87 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar100._0_4_ = auVar72._0_4_ * auVar88._0_4_;
  auVar100._4_4_ = auVar72._4_4_ * auVar88._4_4_;
  auVar100._8_4_ = auVar72._8_4_ * auVar88._8_4_;
  auVar100._12_4_ = auVar72._12_4_ * auVar88._12_4_;
  auVar100._16_4_ = auVar88._16_4_ * 0.0;
  auVar100._20_4_ = auVar88._20_4_ * 0.0;
  auVar100._24_4_ = auVar88._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar58 * -2 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar1));
  auVar92._4_4_ = auVar14._4_4_ * auVar88._4_4_;
  auVar92._0_4_ = auVar14._0_4_ * auVar88._0_4_;
  auVar92._8_4_ = auVar14._8_4_ * auVar88._8_4_;
  auVar92._12_4_ = auVar14._12_4_ * auVar88._12_4_;
  auVar92._16_4_ = auVar88._16_4_ * 0.0;
  auVar92._20_4_ = auVar88._20_4_ * 0.0;
  auVar92._24_4_ = auVar88._24_4_ * 0.0;
  auVar92._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar86);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar1));
  auVar99._0_4_ = auVar14._0_4_ * auVar88._0_4_;
  auVar99._4_4_ = auVar14._4_4_ * auVar88._4_4_;
  auVar99._8_4_ = auVar14._8_4_ * auVar88._8_4_;
  auVar99._12_4_ = auVar14._12_4_ * auVar88._12_4_;
  auVar99._16_4_ = auVar88._16_4_ * 0.0;
  auVar99._20_4_ = auVar88._20_4_ * 0.0;
  auVar99._24_4_ = auVar88._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + uVar58 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar74));
  auVar93._4_4_ = auVar88._4_4_ * auVar70._4_4_;
  auVar93._0_4_ = auVar88._0_4_ * auVar70._0_4_;
  auVar93._8_4_ = auVar88._8_4_ * auVar70._8_4_;
  auVar93._12_4_ = auVar88._12_4_ * auVar70._12_4_;
  auVar93._16_4_ = auVar88._16_4_ * 0.0;
  auVar93._20_4_ = auVar88._20_4_ * 0.0;
  auVar93._24_4_ = auVar88._24_4_ * 0.0;
  auVar93._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar74));
  auVar98._0_4_ = auVar70._0_4_ * auVar88._0_4_;
  auVar98._4_4_ = auVar70._4_4_ * auVar88._4_4_;
  auVar98._8_4_ = auVar70._8_4_ * auVar88._8_4_;
  auVar98._12_4_ = auVar70._12_4_ * auVar88._12_4_;
  auVar98._16_4_ = auVar88._16_4_ * 0.0;
  auVar98._20_4_ = auVar88._20_4_ * 0.0;
  auVar98._24_4_ = auVar88._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar91,auVar100);
  auVar86 = vpminsd_avx2(auVar92,auVar99);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86 = vpminsd_avx2(auVar93,auVar98);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar16._4_4_ = uVar158;
  auVar16._0_4_ = uVar158;
  auVar16._8_4_ = uVar158;
  auVar16._12_4_ = uVar158;
  auVar16._16_4_ = uVar158;
  auVar16._20_4_ = uVar158;
  auVar16._24_4_ = uVar158;
  auVar16._28_4_ = uVar158;
  auVar86 = vmaxps_avx512vl(auVar86,auVar16);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_2a0 = vmulps_avx512vl(auVar88,auVar86);
  auVar88 = vpmaxsd_avx2(auVar91,auVar100);
  auVar86 = vpmaxsd_avx2(auVar92,auVar99);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar86 = vpmaxsd_avx2(auVar93,auVar98);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar89._4_4_ = uVar158;
  auVar89._0_4_ = uVar158;
  auVar89._8_4_ = uVar158;
  auVar89._12_4_ = uVar158;
  auVar89._16_4_ = uVar158;
  auVar89._20_4_ = uVar158;
  auVar89._24_4_ = uVar158;
  auVar89._28_4_ = uVar158;
  auVar86 = vminps_avx512vl(auVar86,auVar89);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar90);
  uVar18 = vpcmpgtd_avx512vl(auVar87,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_2a0,auVar88,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return false;
  }
  local_6c8 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_4c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6d0 = prim;
LAB_01ce2082:
  lVar60 = 0;
  for (uVar59 = local_6c8; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar64 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar64].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(prim + lVar60 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar72 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar59);
  auVar14 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * (uVar59 + 1));
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar73 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  _local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar70 = vunpcklps_avx512vl(local_520._0_16_,local_540._0_16_);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar76 = local_620._0_16_;
  local_7b0 = vinsertps_avx512f(auVar70,auVar76,0x28);
  auVar79._8_4_ = 0xbeaaaaab;
  auVar79._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar79._12_4_ = 0xbeaaaaab;
  auVar74 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar59 * (long)pGVar3[2].pointQueryFunc),auVar72,auVar79);
  auVar1 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar3[2].intersectionFilterN +
                            (long)pGVar3[2].pointQueryFunc * (uVar59 + 1)),auVar14,auVar79);
  auVar80._0_4_ = auVar14._0_4_ + auVar72._0_4_ + auVar74._0_4_ + auVar1._0_4_;
  auVar80._4_4_ = auVar14._4_4_ + auVar72._4_4_ + auVar74._4_4_ + auVar1._4_4_;
  auVar80._8_4_ = auVar14._8_4_ + auVar72._8_4_ + auVar74._8_4_ + auVar1._8_4_;
  auVar80._12_4_ = auVar14._12_4_ + auVar72._12_4_ + auVar74._12_4_ + auVar1._12_4_;
  auVar77._8_4_ = 0x3e800000;
  auVar77._0_8_ = 0x3e8000003e800000;
  auVar77._12_4_ = 0x3e800000;
  auVar70 = vmulps_avx512vl(auVar80,auVar77);
  auVar70 = vsubps_avx(auVar70,auVar73);
  auVar70 = vdpps_avx(auVar70,local_7b0,0x7f);
  fVar203 = *(float *)(ray + k * 4 + 0x60);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  local_460 = vpbroadcastd_avx512vl();
  auVar78._4_12_ = ZEXT812(0) << 0x20;
  auVar78._0_4_ = local_7c0._0_4_;
  auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar78);
  auVar75 = vfnmadd213ss_fma(auVar71,local_7c0,ZEXT416(0x40000000));
  fVar143 = auVar70._0_4_ * auVar71._0_4_ * auVar75._0_4_;
  auVar81._4_4_ = fVar143;
  auVar81._0_4_ = fVar143;
  auVar81._8_4_ = fVar143;
  auVar81._12_4_ = fVar143;
  auVar70 = vfmadd231ps_fma(auVar73,local_7b0,auVar81);
  auVar70 = vblendps_avx(auVar70,ZEXT816(0) << 0x40,8);
  auVar72 = vsubps_avx(auVar72,auVar70);
  auVar73 = vsubps_avx(auVar1,auVar70);
  auVar1 = vsubps_avx(auVar74,auVar70);
  auVar14 = vsubps_avx(auVar14,auVar70);
  uVar158 = auVar72._0_4_;
  auVar242._4_4_ = uVar158;
  auVar242._0_4_ = uVar158;
  auVar242._8_4_ = uVar158;
  auVar242._12_4_ = uVar158;
  auVar242._16_4_ = uVar158;
  auVar242._20_4_ = uVar158;
  auVar242._24_4_ = uVar158;
  auVar242._28_4_ = uVar158;
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  local_640 = ZEXT1632(auVar72);
  auVar88 = vpermps_avx2(auVar108,local_640);
  auVar109._8_4_ = 2;
  auVar109._0_8_ = 0x200000002;
  auVar109._12_4_ = 2;
  auVar109._16_4_ = 2;
  auVar109._20_4_ = 2;
  auVar109._24_4_ = 2;
  auVar109._28_4_ = 2;
  auVar86 = vpermps_avx2(auVar109,local_640);
  auVar110._8_4_ = 3;
  auVar110._0_8_ = 0x300000003;
  auVar110._12_4_ = 3;
  auVar110._16_4_ = 3;
  auVar110._20_4_ = 3;
  auVar110._24_4_ = 3;
  auVar110._28_4_ = 3;
  auVar16 = vpermps_avx2(auVar110,local_640);
  uVar158 = auVar1._0_4_;
  local_260._4_4_ = uVar158;
  local_260._0_4_ = uVar158;
  local_260._8_4_ = uVar158;
  local_260._12_4_ = uVar158;
  local_260._16_4_ = uVar158;
  local_260._20_4_ = uVar158;
  local_260._24_4_ = uVar158;
  local_260._28_4_ = uVar158;
  local_680 = ZEXT1632(auVar1);
  local_6c0 = vpermps_avx2(auVar108,local_680);
  auVar89 = vpermps_avx512vl(auVar109,local_680);
  auVar90 = vpermps_avx512vl(auVar110,local_680);
  auVar87 = vbroadcastss_avx512vl(auVar73);
  local_660 = ZEXT1632(auVar73);
  auVar91 = vpermps_avx512vl(auVar108,local_660);
  auVar92 = vpermps_avx512vl(auVar109,local_660);
  auVar93 = vpermps_avx512vl(auVar110,local_660);
  auVar225 = ZEXT3264(local_6c0);
  auVar94 = vbroadcastss_avx512vl(auVar14);
  _local_6a0 = ZEXT1632(auVar14);
  auVar85 = vpermps_avx512vl(auVar108,_local_6a0);
  auVar95 = vpermps_avx512vl(auVar109,_local_6a0);
  auVar96 = vpermps_avx512vl(auVar110,_local_6a0);
  auVar72 = vmulss_avx512f(auVar76,auVar76);
  auVar83 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),local_540,local_540);
  local_240 = vfmadd231ps_avx512vl(auVar83,_local_520,_local_520);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar107);
  local_730 = ZEXT416((uint)fVar143);
  local_280 = fVar203 - fVar143;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  uVar59 = 0;
  bVar62 = false;
  local_ab4 = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar72 = vsqrtss_avx(local_7c0,local_7c0);
  auVar14 = vsqrtss_avx(local_7c0,local_7c0);
  local_740 = ZEXT816(0x3f80000000000000);
  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar70 = vmovshdup_avx(local_740);
    auVar70 = vsubps_avx(auVar70,local_740);
    fVar157 = auVar70._0_4_;
    fVar174 = fVar157 * 0.04761905;
    auVar214._0_4_ = local_740._0_4_;
    auVar214._4_4_ = auVar214._0_4_;
    auVar214._8_4_ = auVar214._0_4_;
    auVar214._12_4_ = auVar214._0_4_;
    auVar214._16_4_ = auVar214._0_4_;
    auVar214._20_4_ = auVar214._0_4_;
    auVar214._24_4_ = auVar214._0_4_;
    auVar214._28_4_ = auVar214._0_4_;
    auVar240._4_4_ = fVar157;
    auVar240._0_4_ = fVar157;
    auVar240._8_4_ = fVar157;
    auVar240._12_4_ = fVar157;
    auVar240._16_4_ = fVar157;
    auVar240._20_4_ = fVar157;
    auVar240._24_4_ = fVar157;
    auVar240._28_4_ = fVar157;
    auVar70 = vfmadd231ps_fma(auVar214,auVar240,_DAT_01faff20);
    auVar230 = auVar233._0_32_;
    auVar83 = vsubps_avx(auVar230,ZEXT1632(auVar70));
    fVar157 = auVar70._0_4_;
    fVar170 = auVar70._4_4_;
    auVar124._4_4_ = local_260._4_4_ * fVar170;
    auVar124._0_4_ = local_260._0_4_ * fVar157;
    fVar171 = auVar70._8_4_;
    auVar124._8_4_ = local_260._8_4_ * fVar171;
    fVar172 = auVar70._12_4_;
    auVar124._12_4_ = local_260._12_4_ * fVar172;
    auVar124._16_4_ = local_260._16_4_ * 0.0;
    auVar124._20_4_ = local_260._20_4_ * 0.0;
    auVar124._24_4_ = local_260._24_4_ * 0.0;
    auVar124._28_4_ = DAT_01faff20._28_4_;
    auVar98 = ZEXT1632(auVar70);
    auVar116._4_4_ = auVar225._4_4_ * fVar170;
    auVar116._0_4_ = auVar225._0_4_ * fVar157;
    auVar116._8_4_ = auVar225._8_4_ * fVar171;
    auVar116._12_4_ = auVar225._12_4_ * fVar172;
    auVar116._16_4_ = auVar225._16_4_ * 0.0;
    auVar116._20_4_ = auVar225._20_4_ * 0.0;
    auVar116._24_4_ = auVar225._24_4_ * 0.0;
    auVar116._28_4_ = auVar214._0_4_;
    auVar84 = vmulps_avx512vl(auVar89,auVar98);
    auVar97 = vmulps_avx512vl(auVar90,auVar98);
    auVar73 = vfmadd231ps_fma(auVar124,auVar83,auVar242);
    auVar1 = vfmadd231ps_fma(auVar116,auVar83,auVar88);
    auVar74 = vfmadd231ps_fma(auVar84,auVar83,auVar86);
    auVar75 = vfmadd231ps_fma(auVar97,auVar83,auVar16);
    auVar84 = vmulps_avx512vl(auVar87,auVar98);
    auVar102 = ZEXT1632(auVar70);
    auVar97 = vmulps_avx512vl(auVar91,auVar102);
    auVar98 = vmulps_avx512vl(auVar92,auVar102);
    auVar99 = vmulps_avx512vl(auVar93,auVar102);
    auVar71 = vfmadd231ps_fma(auVar84,auVar83,local_260);
    auVar76 = vfmadd231ps_fma(auVar97,auVar83,auVar225._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar98,auVar83,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar99,auVar83,auVar90);
    auVar98 = vmulps_avx512vl(auVar94,auVar102);
    auVar99 = vmulps_avx512vl(auVar85,auVar102);
    auVar100 = vmulps_avx512vl(auVar95,auVar102);
    auVar101 = vmulps_avx512vl(auVar96,auVar102);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar83,auVar87);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar83,auVar91);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar83,auVar92);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar83,auVar93);
    auVar248._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * auVar71._12_4_,
                            CONCAT48(fVar171 * auVar71._8_4_,
                                     CONCAT44(fVar170 * auVar71._4_4_,fVar157 * auVar71._0_4_))));
    auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar76));
    auVar103 = vmulps_avx512vl(ZEXT1632(auVar70),auVar84);
    auVar104 = vmulps_avx512vl(ZEXT1632(auVar70),auVar97);
    auVar70 = vfmadd231ps_fma(auVar248._0_32_,auVar83,ZEXT1632(auVar73));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar83,ZEXT1632(auVar1));
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar83,ZEXT1632(auVar74));
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar83,ZEXT1632(auVar75));
    auVar236._0_4_ = auVar98._0_4_ * fVar157;
    auVar236._4_4_ = auVar98._4_4_ * fVar170;
    auVar236._8_4_ = auVar98._8_4_ * fVar171;
    auVar236._12_4_ = auVar98._12_4_ * fVar172;
    auVar236._16_4_ = auVar98._16_4_ * 0.0;
    auVar236._20_4_ = auVar98._20_4_ * 0.0;
    auVar236._24_4_ = auVar98._24_4_ * 0.0;
    auVar236._28_4_ = 0;
    auVar117._4_4_ = auVar99._4_4_ * fVar170;
    auVar117._0_4_ = auVar99._0_4_ * fVar157;
    auVar117._8_4_ = auVar99._8_4_ * fVar171;
    auVar117._12_4_ = auVar99._12_4_ * fVar172;
    auVar117._16_4_ = auVar99._16_4_ * 0.0;
    auVar117._20_4_ = auVar99._20_4_ * 0.0;
    auVar117._24_4_ = auVar99._24_4_ * 0.0;
    auVar117._28_4_ = auVar98._28_4_;
    auVar118._4_4_ = auVar100._4_4_ * fVar170;
    auVar118._0_4_ = auVar100._0_4_ * fVar157;
    auVar118._8_4_ = auVar100._8_4_ * fVar171;
    auVar118._12_4_ = auVar100._12_4_ * fVar172;
    auVar118._16_4_ = auVar100._16_4_ * 0.0;
    auVar118._20_4_ = auVar100._20_4_ * 0.0;
    auVar118._24_4_ = auVar100._24_4_ * 0.0;
    auVar118._28_4_ = auVar99._28_4_;
    auVar221._4_4_ = auVar101._4_4_ * fVar170;
    auVar221._0_4_ = auVar101._0_4_ * fVar157;
    auVar221._8_4_ = auVar101._8_4_ * fVar171;
    auVar221._12_4_ = auVar101._12_4_ * fVar172;
    auVar221._16_4_ = auVar101._16_4_ * 0.0;
    auVar221._20_4_ = auVar101._20_4_ * 0.0;
    auVar221._24_4_ = auVar101._24_4_ * 0.0;
    auVar221._28_4_ = auVar100._28_4_;
    auVar73 = vfmadd231ps_fma(auVar236,auVar83,ZEXT1632(auVar71));
    auVar1 = vfmadd231ps_fma(auVar117,auVar83,ZEXT1632(auVar76));
    auVar74 = vfmadd231ps_fma(auVar118,auVar83,auVar84);
    auVar75 = vfmadd231ps_fma(auVar221,auVar83,auVar97);
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar73._12_4_,
                                                 CONCAT48(fVar171 * auVar73._8_4_,
                                                          CONCAT44(fVar170 * auVar73._4_4_,
                                                                   fVar157 * auVar73._0_4_)))),
                              auVar83,ZEXT1632(auVar70));
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar1._12_4_ * fVar172,
                                             CONCAT48(auVar1._8_4_ * fVar171,
                                                      CONCAT44(auVar1._4_4_ * fVar170,
                                                               auVar1._0_4_ * fVar157)))),auVar83,
                          auVar102);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar74._12_4_ * fVar172,
                                             CONCAT48(auVar74._8_4_ * fVar171,
                                                      CONCAT44(auVar74._4_4_ * fVar170,
                                                               auVar74._0_4_ * fVar157)))),auVar83,
                          auVar103);
    auVar84 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar75._12_4_ * fVar172,
                                            CONCAT48(auVar75._8_4_ * fVar171,
                                                     CONCAT44(auVar75._4_4_ * fVar170,
                                                              auVar75._0_4_ * fVar157)))),auVar104,
                         auVar83);
    auVar83 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar70));
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar1),auVar102);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar74),auVar103);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar75),auVar104);
    auVar246._0_4_ = fVar174 * auVar83._0_4_ * 3.0;
    auVar246._4_4_ = fVar174 * auVar83._4_4_ * 3.0;
    auVar246._8_4_ = fVar174 * auVar83._8_4_ * 3.0;
    auVar246._12_4_ = fVar174 * auVar83._12_4_ * 3.0;
    auVar246._16_4_ = fVar174 * auVar83._16_4_ * 3.0;
    auVar246._20_4_ = fVar174 * auVar83._20_4_ * 3.0;
    auVar246._24_4_ = fVar174 * auVar83._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar247._0_4_ = fVar174 * auVar97._0_4_ * 3.0;
    auVar247._4_4_ = fVar174 * auVar97._4_4_ * 3.0;
    auVar247._8_4_ = fVar174 * auVar97._8_4_ * 3.0;
    auVar247._12_4_ = fVar174 * auVar97._12_4_ * 3.0;
    auVar247._16_4_ = fVar174 * auVar97._16_4_ * 3.0;
    auVar247._20_4_ = fVar174 * auVar97._20_4_ * 3.0;
    auVar247._24_4_ = fVar174 * auVar97._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    auVar123._4_4_ = fVar174 * auVar98._4_4_ * 3.0;
    auVar123._0_4_ = fVar174 * auVar98._0_4_ * 3.0;
    auVar123._8_4_ = fVar174 * auVar98._8_4_ * 3.0;
    auVar123._12_4_ = fVar174 * auVar98._12_4_ * 3.0;
    auVar123._16_4_ = fVar174 * auVar98._16_4_ * 3.0;
    auVar123._20_4_ = fVar174 * auVar98._20_4_ * 3.0;
    auVar123._24_4_ = fVar174 * auVar98._24_4_ * 3.0;
    auVar123._28_4_ = auVar101._28_4_;
    fVar157 = auVar99._0_4_ * 3.0 * fVar174;
    fVar170 = auVar99._4_4_ * 3.0 * fVar174;
    auVar119._4_4_ = fVar170;
    auVar119._0_4_ = fVar157;
    fVar171 = auVar99._8_4_ * 3.0 * fVar174;
    auVar119._8_4_ = fVar171;
    fVar172 = auVar99._12_4_ * 3.0 * fVar174;
    auVar119._12_4_ = fVar172;
    fVar173 = auVar99._16_4_ * 3.0 * fVar174;
    auVar119._16_4_ = fVar173;
    fVar202 = auVar99._20_4_ * 3.0 * fVar174;
    auVar119._20_4_ = fVar202;
    fVar175 = auVar99._24_4_ * 3.0 * fVar174;
    auVar119._24_4_ = fVar175;
    auVar119._28_4_ = fVar174;
    auVar70 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar70);
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01feed00,ZEXT1632(auVar70));
    auVar102 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,ZEXT1632(auVar70));
    auVar97 = ZEXT1632(auVar70);
    auVar103 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar97);
    auVar231._0_4_ = auVar84._0_4_ + fVar157;
    auVar231._4_4_ = auVar84._4_4_ + fVar170;
    auVar231._8_4_ = auVar84._8_4_ + fVar171;
    auVar231._12_4_ = auVar84._12_4_ + fVar172;
    auVar231._16_4_ = auVar84._16_4_ + fVar173;
    auVar231._20_4_ = auVar84._20_4_ + fVar202;
    auVar231._24_4_ = auVar84._24_4_ + fVar175;
    auVar231._28_4_ = auVar84._28_4_ + fVar174;
    auVar83 = vmaxps_avx(auVar84,auVar231);
    auVar104 = vminps_avx512vl(auVar84,auVar231);
    auVar106 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar97);
    auVar107 = vpermt2ps_avx512vl(auVar246,_DAT_01feed00,auVar97);
    auVar108 = vpermt2ps_avx512vl(auVar247,_DAT_01feed00,auVar97);
    auVar124 = ZEXT1632(auVar70);
    auVar109 = vpermt2ps_avx512vl(auVar123,_DAT_01feed00,auVar124);
    auVar84 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar124);
    auVar84 = vsubps_avx(auVar106,auVar84);
    auVar97 = vsubps_avx(auVar101,ZEXT1632(auVar71));
    auVar98 = vsubps_avx(auVar102,auVar100);
    auVar99 = vsubps_avx(auVar103,auVar105);
    auVar110 = vmulps_avx512vl(auVar98,auVar123);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar247,auVar99);
    auVar111 = vmulps_avx512vl(auVar99,auVar246);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar123,auVar97);
    auVar112 = vmulps_avx512vl(auVar97,auVar247);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar246,auVar98);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar99,auVar99);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar98,auVar98);
    auVar113 = vfmadd231ps_avx512vl(auVar111,auVar97,auVar97);
    auVar111 = vrcp14ps_avx512vl(auVar113);
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar113,auVar230);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar110,auVar111);
    auVar112 = vmulps_avx512vl(auVar98,auVar109);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar108,auVar99);
    auVar114 = vmulps_avx512vl(auVar99,auVar107);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar109,auVar97);
    auVar115 = vmulps_avx512vl(auVar97,auVar108);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar107,auVar98);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar110 = vmaxps_avx512vl(auVar110,auVar111);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar111 = vmaxps_avx512vl(auVar84,auVar106);
    auVar83 = vmaxps_avx512vl(auVar83,auVar111);
    auVar115 = vaddps_avx512vl(auVar110,auVar83);
    auVar83 = vminps_avx(auVar84,auVar106);
    auVar83 = vminps_avx512vl(auVar104,auVar83);
    auVar83 = vsubps_avx512vl(auVar83,auVar110);
    auVar111._8_4_ = 0x3f800002;
    auVar111._0_8_ = 0x3f8000023f800002;
    auVar111._12_4_ = 0x3f800002;
    auVar111._16_4_ = 0x3f800002;
    auVar111._20_4_ = 0x3f800002;
    auVar111._24_4_ = 0x3f800002;
    auVar111._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar115,auVar111);
    auVar112._8_4_ = 0x3f7ffffc;
    auVar112._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar112._12_4_ = 0x3f7ffffc;
    auVar112._16_4_ = 0x3f7ffffc;
    auVar112._20_4_ = 0x3f7ffffc;
    auVar112._24_4_ = 0x3f7ffffc;
    auVar112._28_4_ = 0x3f7ffffc;
    auVar83 = vmulps_avx512vl(auVar83,auVar112);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar104 = vrsqrt14ps_avx512vl(auVar113);
    auVar114._8_4_ = 0xbf000000;
    auVar114._0_8_ = 0xbf000000bf000000;
    auVar114._12_4_ = 0xbf000000;
    auVar114._16_4_ = 0xbf000000;
    auVar114._20_4_ = 0xbf000000;
    auVar114._24_4_ = 0xbf000000;
    auVar114._28_4_ = 0xbf000000;
    auVar106 = vmulps_avx512vl(auVar113,auVar114);
    fVar157 = auVar104._0_4_;
    fVar170 = auVar104._4_4_;
    fVar171 = auVar104._8_4_;
    fVar172 = auVar104._12_4_;
    fVar174 = auVar104._16_4_;
    fVar173 = auVar104._20_4_;
    fVar202 = auVar104._24_4_;
    auVar120._4_4_ = fVar170 * fVar170 * fVar170 * auVar106._4_4_;
    auVar120._0_4_ = fVar157 * fVar157 * fVar157 * auVar106._0_4_;
    auVar120._8_4_ = fVar171 * fVar171 * fVar171 * auVar106._8_4_;
    auVar120._12_4_ = fVar172 * fVar172 * fVar172 * auVar106._12_4_;
    auVar120._16_4_ = fVar174 * fVar174 * fVar174 * auVar106._16_4_;
    auVar120._20_4_ = fVar173 * fVar173 * fVar173 * auVar106._20_4_;
    auVar120._24_4_ = fVar202 * fVar202 * fVar202 * auVar106._24_4_;
    auVar120._28_4_ = auVar115._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar120,auVar104,auVar113);
    auVar248 = ZEXT3264(auVar104);
    auVar106 = vmulps_avx512vl(auVar97,auVar104);
    auVar110 = vmulps_avx512vl(auVar98,auVar104);
    auVar111 = vmulps_avx512vl(auVar99,auVar104);
    auVar221 = ZEXT1632(auVar71);
    auVar112 = vsubps_avx512vl(auVar124,auVar221);
    auVar114 = vsubps_avx512vl(auVar124,auVar100);
    auVar113 = vsubps_avx512vl(auVar124,auVar105);
    auVar115 = vmulps_avx512vl(local_620,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_540,auVar114);
    auVar115 = vfmadd231ps_avx512vl(auVar115,_local_520,auVar112);
    auVar116 = vmulps_avx512vl(auVar113,auVar113);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
    auVar117 = vmulps_avx512vl(local_620,auVar111);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar110,local_540);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar106,_local_520);
    auVar111 = vmulps_avx512vl(auVar113,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar110);
    auVar106 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar106);
    auVar110 = vmulps_avx512vl(auVar117,auVar117);
    auVar111 = vsubps_avx512vl(local_220,auVar110);
    auVar118 = vmulps_avx512vl(auVar117,auVar106);
    auVar115 = vsubps_avx512vl(auVar115,auVar118);
    auVar118 = vaddps_avx512vl(auVar115,auVar115);
    auVar115 = vmulps_avx512vl(auVar106,auVar106);
    local_780 = vsubps_avx512vl(auVar116,auVar115);
    auVar84 = vsubps_avx512vl(local_780,auVar84);
    local_560 = vmulps_avx512vl(auVar118,auVar118);
    auVar115._8_4_ = 0x40800000;
    auVar115._0_8_ = 0x4080000040800000;
    auVar115._12_4_ = 0x40800000;
    auVar115._16_4_ = 0x40800000;
    auVar115._20_4_ = 0x40800000;
    auVar115._24_4_ = 0x40800000;
    auVar115._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar111,auVar115);
    auVar115 = vmulps_avx512vl(_local_580,auVar84);
    auVar115 = vsubps_avx512vl(local_560,auVar115);
    uVar68 = vcmpps_avx512vl(auVar115,auVar124,5);
    bVar53 = (byte)uVar68;
    if (bVar53 == 0) {
      auVar233 = ZEXT3264(auVar230);
LAB_01ce2cb3:
      auVar225 = ZEXT3264(local_6c0);
    }
    else {
      auVar115 = vsqrtps_avx512vl(auVar115);
      auVar116 = vaddps_avx512vl(auVar111,auVar111);
      local_600 = vrcp14ps_avx512vl(auVar116);
      in_ZMM31 = ZEXT3264(local_600);
      auVar119 = vfnmadd213ps_avx512vl(local_600,auVar116,auVar230);
      auVar119 = vfmadd132ps_avx512vl(auVar119,local_600,local_600);
      auVar230._8_4_ = 0x80000000;
      auVar230._0_8_ = 0x8000000080000000;
      auVar230._12_4_ = 0x80000000;
      auVar230._16_4_ = 0x80000000;
      auVar230._20_4_ = 0x80000000;
      auVar230._24_4_ = 0x80000000;
      auVar230._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar118,auVar230);
      auVar120 = vsubps_avx512vl(local_5a0,auVar115);
      local_7a0 = vmulps_avx512vl(auVar120,auVar119);
      auVar115 = vsubps_avx512vl(auVar115,auVar118);
      local_7e0 = vmulps_avx512vl(auVar115,auVar119);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar115,local_7a0);
      auVar121._0_4_ =
           (uint)(bVar53 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar115._0_4_;
      bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar66 * auVar119._4_4_ | (uint)!bVar66 * auVar115._4_4_;
      bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar66 * auVar119._8_4_ | (uint)!bVar66 * auVar115._8_4_;
      bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar66 * auVar119._12_4_ | (uint)!bVar66 * auVar115._12_4_;
      bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar66 * auVar119._16_4_ | (uint)!bVar66 * auVar115._16_4_;
      bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar66 * auVar119._20_4_ | (uint)!bVar66 * auVar115._20_4_;
      bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar66 * auVar119._24_4_ | (uint)!bVar66 * auVar115._24_4_;
      bVar66 = SUB81(uVar68 >> 7,0);
      auVar121._28_4_ = (uint)bVar66 * auVar119._28_4_ | (uint)!bVar66 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar115,local_7e0);
      auVar122._0_4_ =
           (uint)(bVar53 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar115._0_4_;
      bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar66 * auVar119._4_4_ | (uint)!bVar66 * auVar115._4_4_;
      bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar66 * auVar119._8_4_ | (uint)!bVar66 * auVar115._8_4_;
      bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar66 * auVar119._12_4_ | (uint)!bVar66 * auVar115._12_4_;
      bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar66 * auVar119._16_4_ | (uint)!bVar66 * auVar115._16_4_;
      bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar66 * auVar119._20_4_ | (uint)!bVar66 * auVar115._20_4_;
      bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar66 * auVar119._24_4_ | (uint)!bVar66 * auVar115._24_4_;
      bVar66 = SUB81(uVar68 >> 7,0);
      auVar122._28_4_ = (uint)bVar66 * auVar119._28_4_ | (uint)!bVar66 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar115);
      local_5c0 = vmaxps_avx512vl(local_240,auVar115);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar31);
      vandps_avx512vl(auVar111,auVar115);
      uVar58 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar68 = uVar68 & uVar58;
      bVar55 = (byte)uVar68;
      if (bVar55 != 0) {
        uVar58 = vcmpps_avx512vl(auVar84,_DAT_01faff00,2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar111 = vblendmps_avx512vl(auVar84,auVar110);
        bVar61 = (byte)uVar58;
        uVar69 = (uint)(bVar61 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar61 & 1) * local_5e0._0_4_;
        bVar66 = (bool)((byte)(uVar58 >> 1) & 1);
        uVar57 = (uint)bVar66 * auVar111._4_4_ | (uint)!bVar66 * local_5e0._4_4_;
        bVar66 = (bool)((byte)(uVar58 >> 2) & 1);
        uVar136 = (uint)bVar66 * auVar111._8_4_ | (uint)!bVar66 * local_5e0._8_4_;
        bVar66 = (bool)((byte)(uVar58 >> 3) & 1);
        uVar137 = (uint)bVar66 * auVar111._12_4_ | (uint)!bVar66 * local_5e0._12_4_;
        bVar66 = (bool)((byte)(uVar58 >> 4) & 1);
        uVar138 = (uint)bVar66 * auVar111._16_4_ | (uint)!bVar66 * local_5e0._16_4_;
        bVar66 = (bool)((byte)(uVar58 >> 5) & 1);
        uVar139 = (uint)bVar66 * auVar111._20_4_ | (uint)!bVar66 * local_5e0._20_4_;
        bVar66 = (bool)((byte)(uVar58 >> 6) & 1);
        uVar140 = (uint)bVar66 * auVar111._24_4_ | (uint)!bVar66 * local_5e0._24_4_;
        bVar66 = SUB81(uVar58 >> 7,0);
        uVar141 = (uint)bVar66 * auVar111._28_4_ | (uint)!bVar66 * local_5e0._28_4_;
        auVar121._0_4_ = (bVar55 & 1) * uVar69 | !(bool)(bVar55 & 1) * auVar121._0_4_;
        bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar121._4_4_ = bVar66 * uVar57 | !bVar66 * auVar121._4_4_;
        bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar121._8_4_ = bVar66 * uVar136 | !bVar66 * auVar121._8_4_;
        bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar121._12_4_ = bVar66 * uVar137 | !bVar66 * auVar121._12_4_;
        bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar121._16_4_ = bVar66 * uVar138 | !bVar66 * auVar121._16_4_;
        bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar121._20_4_ = bVar66 * uVar139 | !bVar66 * auVar121._20_4_;
        bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar121._24_4_ = bVar66 * uVar140 | !bVar66 * auVar121._24_4_;
        bVar66 = SUB81(uVar68 >> 7,0);
        auVar121._28_4_ = bVar66 * uVar141 | !bVar66 * auVar121._28_4_;
        auVar84 = vblendmps_avx512vl(auVar110,auVar84);
        bVar66 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar12 = SUB81(uVar58 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar55 & 1) *
             ((uint)(bVar61 & 1) * auVar84._0_4_ | !(bool)(bVar61 & 1) * uVar69) |
             !(bool)(bVar55 & 1) * auVar122._0_4_;
        bVar6 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar6 * ((uint)bVar66 * auVar84._4_4_ | !bVar66 * uVar57) |
             !bVar6 * auVar122._4_4_;
        bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar66 * ((uint)bVar7 * auVar84._8_4_ | !bVar7 * uVar136) |
             !bVar66 * auVar122._8_4_;
        bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar66 * ((uint)bVar8 * auVar84._12_4_ | !bVar8 * uVar137) |
             !bVar66 * auVar122._12_4_;
        bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar66 * ((uint)bVar9 * auVar84._16_4_ | !bVar9 * uVar138) |
             !bVar66 * auVar122._16_4_;
        bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar66 * ((uint)bVar10 * auVar84._20_4_ | !bVar10 * uVar139) |
             !bVar66 * auVar122._20_4_;
        bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar66 * ((uint)bVar11 * auVar84._24_4_ | !bVar11 * uVar140) |
             !bVar66 * auVar122._24_4_;
        bVar66 = SUB81(uVar68 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar66 * ((uint)bVar12 * auVar84._28_4_ | !bVar12 * uVar141) |
             !bVar66 * auVar122._28_4_;
        bVar53 = (~bVar55 | bVar61) & bVar53;
      }
      if ((bVar53 & 0x7f) == 0) {
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01ce2cb3;
      }
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar109 = vxorps_avx512vl(auVar109,auVar110);
      auVar107 = vxorps_avx512vl(auVar107,auVar110);
      uVar69 = *(uint *)(ray + k * 4 + 0x100);
      auVar108 = vxorps_avx512vl(auVar108,auVar110);
      auVar70 = vsubss_avx512f(ZEXT416(uVar69),ZEXT416((uint)local_730._0_4_));
      auVar84 = vbroadcastss_avx512vl(auVar70);
      auVar111 = vminps_avx512vl(auVar84,auVar122);
      auVar52._4_4_ = fStack_27c;
      auVar52._0_4_ = local_280;
      auVar52._8_4_ = fStack_278;
      auVar52._12_4_ = fStack_274;
      auVar52._16_4_ = fStack_270;
      auVar52._20_4_ = fStack_26c;
      auVar52._24_4_ = fStack_268;
      auVar52._28_4_ = fStack_264;
      auVar84 = vmaxps_avx512vl(auVar52,auVar121);
      auVar113 = vmulps_avx512vl(auVar113,auVar123);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar247,auVar113);
      auVar70 = vfmadd213ps_fma(auVar112,auVar246,auVar114);
      in_ZMM31 = ZEXT3264(local_620);
      auVar112 = vmulps_avx512vl(local_620,auVar123);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_540,auVar247);
      auVar112 = vfmadd231ps_avx512vl(auVar112,_local_520,auVar246);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar114);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar114,auVar113,1);
      auVar115 = vxorps_avx512vl(ZEXT1632(auVar70),auVar110);
      auVar123 = vrcp14ps_avx512vl(auVar112);
      auVar119 = vxorps_avx512vl(auVar112,auVar110);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar124 = vfnmadd213ps_avx512vl(auVar123,auVar112,auVar120);
      auVar70 = vfmadd132ps_fma(auVar124,auVar123,auVar123);
      fVar157 = auVar70._0_4_ * auVar115._0_4_;
      fVar170 = auVar70._4_4_ * auVar115._4_4_;
      auVar37._4_4_ = fVar170;
      auVar37._0_4_ = fVar157;
      fVar171 = auVar70._8_4_ * auVar115._8_4_;
      auVar37._8_4_ = fVar171;
      fVar172 = auVar70._12_4_ * auVar115._12_4_;
      auVar37._12_4_ = fVar172;
      fVar174 = auVar115._16_4_ * 0.0;
      auVar37._16_4_ = fVar174;
      fVar173 = auVar115._20_4_ * 0.0;
      auVar37._20_4_ = fVar173;
      fVar202 = auVar115._24_4_ * 0.0;
      auVar37._24_4_ = fVar202;
      auVar37._28_4_ = auVar115._28_4_;
      uVar18 = vcmpps_avx512vl(auVar112,auVar119,1);
      bVar55 = (byte)uVar17 | (byte)uVar18;
      auVar243._8_4_ = 0xff800000;
      auVar243._0_8_ = 0xff800000ff800000;
      auVar243._12_4_ = 0xff800000;
      auVar243._16_4_ = 0xff800000;
      auVar243._20_4_ = 0xff800000;
      auVar243._24_4_ = 0xff800000;
      auVar243._28_4_ = 0xff800000;
      auVar124 = vblendmps_avx512vl(auVar37,auVar243);
      auVar125._0_4_ =
           (uint)(bVar55 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar123._0_4_;
      bVar66 = (bool)(bVar55 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar66 * auVar124._4_4_ | (uint)!bVar66 * auVar123._4_4_;
      bVar66 = (bool)(bVar55 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar66 * auVar124._8_4_ | (uint)!bVar66 * auVar123._8_4_;
      bVar66 = (bool)(bVar55 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar66 * auVar124._12_4_ | (uint)!bVar66 * auVar123._12_4_;
      bVar66 = (bool)(bVar55 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar66 * auVar124._16_4_ | (uint)!bVar66 * auVar123._16_4_;
      bVar66 = (bool)(bVar55 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar66 * auVar124._20_4_ | (uint)!bVar66 * auVar123._20_4_;
      bVar66 = (bool)(bVar55 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar66 * auVar124._24_4_ | (uint)!bVar66 * auVar123._24_4_;
      auVar125._28_4_ =
           (uint)(bVar55 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar123._28_4_;
      auVar123 = vmaxps_avx512vl(auVar84,auVar125);
      uVar18 = vcmpps_avx512vl(auVar112,auVar119,6);
      bVar55 = (byte)uVar17 | (byte)uVar18;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126._0_4_ =
           (uint)(bVar55 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar157;
      bVar66 = (bool)(bVar55 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar66 * auVar112._4_4_ | (uint)!bVar66 * (int)fVar170;
      bVar66 = (bool)(bVar55 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar66 * auVar112._8_4_ | (uint)!bVar66 * (int)fVar171;
      bVar66 = (bool)(bVar55 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar66 * auVar112._12_4_ | (uint)!bVar66 * (int)fVar172;
      bVar66 = (bool)(bVar55 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar66 * auVar112._16_4_ | (uint)!bVar66 * (int)fVar174;
      bVar66 = (bool)(bVar55 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar66 * auVar112._20_4_ | (uint)!bVar66 * (int)fVar173;
      bVar66 = (bool)(bVar55 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar66 * auVar112._24_4_ | (uint)!bVar66 * (int)fVar202;
      auVar126._28_4_ =
           (uint)(bVar55 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar115._28_4_;
      auVar115 = vminps_avx512vl(auVar111,auVar126);
      auVar84 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
      auVar101 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
      auVar119 = ZEXT832(0) << 0x20;
      auVar102 = vsubps_avx(auVar119,auVar103);
      auVar102 = vmulps_avx512vl(auVar102,auVar109);
      auVar101 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar101);
      auVar84 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar84);
      auVar101 = vmulps_avx512vl(local_620,auVar109);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_540,auVar108);
      auVar101 = vfmadd231ps_avx512vl(auVar101,_local_520,auVar107);
      vandps_avx512vl(auVar101,auVar114);
      uVar17 = vcmpps_avx512vl(auVar101,auVar113,1);
      auVar102 = vxorps_avx512vl(auVar84,auVar110);
      auVar84 = vrcp14ps_avx512vl(auVar101);
      auVar103 = vxorps_avx512vl(auVar101,auVar110);
      auVar107 = vfnmadd213ps_avx512vl(auVar84,auVar101,auVar120);
      auVar70 = vfmadd132ps_fma(auVar107,auVar84,auVar84);
      fVar157 = auVar70._0_4_ * auVar102._0_4_;
      fVar170 = auVar70._4_4_ * auVar102._4_4_;
      auVar38._4_4_ = fVar170;
      auVar38._0_4_ = fVar157;
      fVar171 = auVar70._8_4_ * auVar102._8_4_;
      auVar38._8_4_ = fVar171;
      fVar172 = auVar70._12_4_ * auVar102._12_4_;
      auVar38._12_4_ = fVar172;
      fVar174 = auVar102._16_4_ * 0.0;
      auVar38._16_4_ = fVar174;
      fVar173 = auVar102._20_4_ * 0.0;
      auVar38._20_4_ = fVar173;
      fVar202 = auVar102._24_4_ * 0.0;
      auVar38._24_4_ = fVar202;
      auVar38._28_4_ = auVar102._28_4_;
      uVar18 = vcmpps_avx512vl(auVar101,auVar103,1);
      bVar55 = (byte)uVar17 | (byte)uVar18;
      auVar107 = vblendmps_avx512vl(auVar38,auVar243);
      auVar127._0_4_ =
           (uint)(bVar55 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar84._0_4_;
      bVar66 = (bool)(bVar55 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar66 * auVar107._4_4_ | (uint)!bVar66 * auVar84._4_4_;
      bVar66 = (bool)(bVar55 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar66 * auVar107._8_4_ | (uint)!bVar66 * auVar84._8_4_;
      bVar66 = (bool)(bVar55 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar66 * auVar107._12_4_ | (uint)!bVar66 * auVar84._12_4_;
      bVar66 = (bool)(bVar55 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar66 * auVar107._16_4_ | (uint)!bVar66 * auVar84._16_4_;
      bVar66 = (bool)(bVar55 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar66 * auVar107._20_4_ | (uint)!bVar66 * auVar84._20_4_;
      bVar66 = (bool)(bVar55 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar66 * auVar107._24_4_ | (uint)!bVar66 * auVar84._24_4_;
      auVar127._28_4_ =
           (uint)(bVar55 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar84._28_4_;
      auVar84 = vmaxps_avx(auVar123,auVar127);
      uVar18 = vcmpps_avx512vl(auVar101,auVar103,6);
      bVar55 = (byte)uVar17 | (byte)uVar18;
      auVar128._0_4_ =
           (uint)(bVar55 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar157;
      bVar66 = (bool)(bVar55 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar66 * auVar112._4_4_ | (uint)!bVar66 * (int)fVar170;
      bVar66 = (bool)(bVar55 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar66 * auVar112._8_4_ | (uint)!bVar66 * (int)fVar171;
      bVar66 = (bool)(bVar55 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar66 * auVar112._12_4_ | (uint)!bVar66 * (int)fVar172;
      bVar66 = (bool)(bVar55 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar66 * auVar112._16_4_ | (uint)!bVar66 * (int)fVar174;
      bVar66 = (bool)(bVar55 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar66 * auVar112._20_4_ | (uint)!bVar66 * (int)fVar173;
      bVar66 = (bool)(bVar55 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar66 * auVar112._24_4_ | (uint)!bVar66 * (int)fVar202;
      auVar128._28_4_ =
           (uint)(bVar55 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar102._28_4_;
      local_300 = vminps_avx(auVar115,auVar128);
      uVar17 = vcmpps_avx512vl(auVar84,local_300,2);
      bVar53 = bVar53 & 0x7f & (byte)uVar17;
      if (bVar53 == 0) {
        auVar233 = ZEXT3264(auVar120);
        goto LAB_01ce2cb3;
      }
      auVar83 = vmaxps_avx(auVar119,auVar83);
      auVar101 = vfmadd213ps_avx512vl(local_7a0,auVar117,auVar106);
      fVar157 = auVar104._0_4_;
      fVar170 = auVar104._4_4_;
      auVar39._4_4_ = fVar170 * auVar101._4_4_;
      auVar39._0_4_ = fVar157 * auVar101._0_4_;
      fVar171 = auVar104._8_4_;
      auVar39._8_4_ = fVar171 * auVar101._8_4_;
      fVar172 = auVar104._12_4_;
      auVar39._12_4_ = fVar172 * auVar101._12_4_;
      fVar174 = auVar104._16_4_;
      auVar39._16_4_ = fVar174 * auVar101._16_4_;
      fVar173 = auVar104._20_4_;
      auVar39._20_4_ = fVar173 * auVar101._20_4_;
      fVar202 = auVar104._24_4_;
      auVar39._24_4_ = fVar202 * auVar101._24_4_;
      auVar39._28_4_ = auVar101._28_4_;
      auVar101 = vfmadd213ps_avx512vl(local_7e0,auVar117,auVar106);
      auVar40._4_4_ = fVar170 * auVar101._4_4_;
      auVar40._0_4_ = fVar157 * auVar101._0_4_;
      auVar40._8_4_ = fVar171 * auVar101._8_4_;
      auVar40._12_4_ = fVar172 * auVar101._12_4_;
      auVar40._16_4_ = fVar174 * auVar101._16_4_;
      auVar40._20_4_ = fVar173 * auVar101._20_4_;
      auVar40._24_4_ = fVar202 * auVar101._24_4_;
      auVar40._28_4_ = auVar127._28_4_;
      auVar101 = vminps_avx512vl(auVar39,auVar120);
      auVar49 = ZEXT812(0);
      auVar102 = ZEXT1232(auVar49) << 0x20;
      auVar101 = vmaxps_avx(auVar101,ZEXT1232(auVar49) << 0x20);
      auVar103 = vminps_avx512vl(auVar40,auVar120);
      auVar41._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar101._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar41,auVar240,auVar214);
      auVar101 = vmaxps_avx(auVar103,ZEXT1232(auVar49) << 0x20);
      auVar42._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar101._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar42,auVar240,auVar214);
      auVar43._4_4_ = auVar83._4_4_ * auVar83._4_4_;
      auVar43._0_4_ = auVar83._0_4_ * auVar83._0_4_;
      auVar43._8_4_ = auVar83._8_4_ * auVar83._8_4_;
      auVar43._12_4_ = auVar83._12_4_ * auVar83._12_4_;
      auVar43._16_4_ = auVar83._16_4_ * auVar83._16_4_;
      auVar43._20_4_ = auVar83._20_4_ * auVar83._20_4_;
      auVar43._24_4_ = auVar83._24_4_ * auVar83._24_4_;
      auVar43._28_4_ = auVar83._28_4_;
      auVar101 = vsubps_avx(local_780,auVar43);
      auVar44._4_4_ = auVar101._4_4_ * (float)local_580._4_4_;
      auVar44._0_4_ = auVar101._0_4_ * (float)local_580._0_4_;
      auVar44._8_4_ = auVar101._8_4_ * fStack_578;
      auVar44._12_4_ = auVar101._12_4_ * fStack_574;
      auVar44._16_4_ = auVar101._16_4_ * fStack_570;
      auVar44._20_4_ = auVar101._20_4_ * fStack_56c;
      auVar44._24_4_ = auVar101._24_4_ * fStack_568;
      auVar44._28_4_ = auVar83._28_4_;
      auVar83 = vsubps_avx(local_560,auVar44);
      uVar17 = vcmpps_avx512vl(auVar83,ZEXT1232(auVar49) << 0x20,5);
      bVar55 = (byte)uVar17;
      if (bVar55 == 0) {
        bVar55 = 0;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar225 = ZEXT864(0) << 0x20;
        auVar83 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar245 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar73 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        uVar68 = vcmpps_avx512vl(auVar83,auVar119,5);
        auVar83 = vsqrtps_avx(auVar83);
        auVar102 = vfnmadd213ps_avx512vl(auVar116,local_600,auVar120);
        auVar107 = vfmadd132ps_avx512vl(auVar102,local_600,local_600);
        auVar102 = vsubps_avx(local_5a0,auVar83);
        auVar108 = vmulps_avx512vl(auVar102,auVar107);
        auVar83 = vsubps_avx512vl(auVar83,auVar118);
        auVar107 = vmulps_avx512vl(auVar83,auVar107);
        auVar83 = vfmadd213ps_avx512vl(auVar117,auVar108,auVar106);
        auVar45._4_4_ = fVar170 * auVar83._4_4_;
        auVar45._0_4_ = fVar157 * auVar83._0_4_;
        auVar45._8_4_ = fVar171 * auVar83._8_4_;
        auVar45._12_4_ = fVar172 * auVar83._12_4_;
        auVar45._16_4_ = fVar174 * auVar83._16_4_;
        auVar45._20_4_ = fVar173 * auVar83._20_4_;
        auVar45._24_4_ = fVar202 * auVar83._24_4_;
        auVar45._28_4_ = auVar103._28_4_;
        auVar46._4_4_ = (float)local_520._4_4_ * auVar108._4_4_;
        auVar46._0_4_ = (float)local_520._0_4_ * auVar108._0_4_;
        auVar46._8_4_ = fStack_518 * auVar108._8_4_;
        auVar46._12_4_ = fStack_514 * auVar108._12_4_;
        auVar46._16_4_ = fStack_510 * auVar108._16_4_;
        auVar46._20_4_ = fStack_50c * auVar108._20_4_;
        auVar46._24_4_ = fStack_508 * auVar108._24_4_;
        auVar46._28_4_ = auVar83._28_4_;
        auVar102 = vmulps_avx512vl(local_540,auVar108);
        auVar109 = vmulps_avx512vl(local_620,auVar108);
        auVar83 = vfmadd213ps_avx512vl(auVar97,auVar45,auVar221);
        auVar83 = vsubps_avx512vl(auVar46,auVar83);
        auVar103 = vfmadd213ps_avx512vl(auVar98,auVar45,auVar100);
        auVar103 = vsubps_avx512vl(auVar102,auVar103);
        auVar70 = vfmadd213ps_fma(auVar45,auVar99,auVar105);
        auVar102 = vsubps_avx(auVar109,ZEXT1632(auVar70));
        auVar245 = auVar102._0_28_;
        auVar102 = vfmadd213ps_avx512vl(auVar117,auVar107,auVar106);
        auVar104 = vmulps_avx512vl(auVar104,auVar102);
        auVar248 = ZEXT3264(auVar104);
        auVar47._4_4_ = (float)local_520._4_4_ * auVar107._4_4_;
        auVar47._0_4_ = (float)local_520._0_4_ * auVar107._0_4_;
        auVar47._8_4_ = fStack_518 * auVar107._8_4_;
        auVar47._12_4_ = fStack_514 * auVar107._12_4_;
        auVar47._16_4_ = fStack_510 * auVar107._16_4_;
        auVar47._20_4_ = fStack_50c * auVar107._20_4_;
        auVar47._24_4_ = fStack_508 * auVar107._24_4_;
        auVar47._28_4_ = auVar109._28_4_;
        auVar106 = vmulps_avx512vl(local_540,auVar107);
        auVar109 = vmulps_avx512vl(local_620,auVar107);
        auVar70 = vfmadd213ps_fma(auVar97,auVar104,auVar221);
        auVar102 = vsubps_avx(auVar47,ZEXT1632(auVar70));
        auVar70 = vfmadd213ps_fma(auVar98,auVar104,auVar100);
        auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar70));
        auVar70 = vfmadd213ps_fma(auVar99,auVar104,auVar105);
        auVar98 = vsubps_avx512vl(auVar109,ZEXT1632(auVar70));
        auVar225 = ZEXT3264(auVar98);
        auVar198._8_4_ = 0x7f800000;
        auVar198._0_8_ = 0x7f8000007f800000;
        auVar198._12_4_ = 0x7f800000;
        auVar198._16_4_ = 0x7f800000;
        auVar198._20_4_ = 0x7f800000;
        auVar198._24_4_ = 0x7f800000;
        auVar198._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar198,auVar108);
        bVar66 = (bool)((byte)uVar68 & 1);
        auVar129._0_4_ = (uint)bVar66 * auVar98._0_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar66 * auVar98._4_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar66 * auVar98._8_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar66 * auVar98._12_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar66 * auVar98._16_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar66 * auVar98._20_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar66 * auVar98._24_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = SUB81(uVar68 >> 7,0);
        auVar129._28_4_ = (uint)bVar66 * auVar98._28_4_ | (uint)!bVar66 * 0x7f800000;
        auVar222._8_4_ = 0xff800000;
        auVar222._0_8_ = 0xff800000ff800000;
        auVar222._12_4_ = 0xff800000;
        auVar222._16_4_ = 0xff800000;
        auVar222._20_4_ = 0xff800000;
        auVar222._24_4_ = 0xff800000;
        auVar222._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar222,auVar107);
        bVar66 = (bool)((byte)uVar68 & 1);
        auVar130._0_4_ = (uint)bVar66 * auVar98._0_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar66 * auVar98._4_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar66 * auVar98._8_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar66 * auVar98._12_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar66 * auVar98._16_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar66 * auVar98._20_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar66 * auVar98._24_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = SUB81(uVar68 >> 7,0);
        auVar130._28_4_ = (uint)bVar66 * auVar98._28_4_ | (uint)!bVar66 * -0x800000;
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(local_5c0,auVar32);
        uVar58 = vcmpps_avx512vl(auVar98,local_5e0,0xe);
        uVar68 = uVar68 & uVar58;
        bVar61 = (byte)uVar68;
        if (bVar61 != 0) {
          uVar58 = vcmpps_avx512vl(auVar101,ZEXT1632(auVar73),2);
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar244._8_4_ = 0xff800000;
          auVar244._0_8_ = 0xff800000ff800000;
          auVar244._12_4_ = 0xff800000;
          auVar244._16_4_ = 0xff800000;
          auVar244._20_4_ = 0xff800000;
          auVar244._24_4_ = 0xff800000;
          auVar244._28_4_ = 0xff800000;
          auVar99 = vblendmps_avx512vl(auVar241,auVar244);
          bVar63 = (byte)uVar58;
          uVar57 = (uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar98._0_4_;
          bVar66 = (bool)((byte)(uVar58 >> 1) & 1);
          uVar136 = (uint)bVar66 * auVar99._4_4_ | (uint)!bVar66 * auVar98._4_4_;
          bVar66 = (bool)((byte)(uVar58 >> 2) & 1);
          uVar137 = (uint)bVar66 * auVar99._8_4_ | (uint)!bVar66 * auVar98._8_4_;
          bVar66 = (bool)((byte)(uVar58 >> 3) & 1);
          uVar138 = (uint)bVar66 * auVar99._12_4_ | (uint)!bVar66 * auVar98._12_4_;
          bVar66 = (bool)((byte)(uVar58 >> 4) & 1);
          uVar139 = (uint)bVar66 * auVar99._16_4_ | (uint)!bVar66 * auVar98._16_4_;
          bVar66 = (bool)((byte)(uVar58 >> 5) & 1);
          uVar140 = (uint)bVar66 * auVar99._20_4_ | (uint)!bVar66 * auVar98._20_4_;
          bVar66 = (bool)((byte)(uVar58 >> 6) & 1);
          uVar141 = (uint)bVar66 * auVar99._24_4_ | (uint)!bVar66 * auVar98._24_4_;
          bVar66 = SUB81(uVar58 >> 7,0);
          uVar142 = (uint)bVar66 * auVar99._28_4_ | (uint)!bVar66 * auVar98._28_4_;
          auVar129._0_4_ = (bVar61 & 1) * uVar57 | !(bool)(bVar61 & 1) * auVar129._0_4_;
          bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar129._4_4_ = bVar66 * uVar136 | !bVar66 * auVar129._4_4_;
          bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar129._8_4_ = bVar66 * uVar137 | !bVar66 * auVar129._8_4_;
          bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar129._12_4_ = bVar66 * uVar138 | !bVar66 * auVar129._12_4_;
          bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar129._16_4_ = bVar66 * uVar139 | !bVar66 * auVar129._16_4_;
          bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar129._20_4_ = bVar66 * uVar140 | !bVar66 * auVar129._20_4_;
          bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar129._24_4_ = bVar66 * uVar141 | !bVar66 * auVar129._24_4_;
          bVar66 = SUB81(uVar68 >> 7,0);
          auVar129._28_4_ = bVar66 * uVar142 | !bVar66 * auVar129._28_4_;
          auVar98 = vblendmps_avx512vl(auVar244,auVar241);
          bVar66 = (bool)((byte)(uVar58 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar58 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar58 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar58 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar58 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar58 >> 6) & 1);
          bVar12 = SUB81(uVar58 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar63 & 1) * auVar98._0_4_ | !(bool)(bVar63 & 1) * uVar57) |
               !(bool)(bVar61 & 1) * auVar130._0_4_;
          bVar6 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar6 * ((uint)bVar66 * auVar98._4_4_ | !bVar66 * uVar136) |
               !bVar6 * auVar130._4_4_;
          bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar66 * ((uint)bVar7 * auVar98._8_4_ | !bVar7 * uVar137) |
               !bVar66 * auVar130._8_4_;
          bVar66 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar66 * ((uint)bVar8 * auVar98._12_4_ | !bVar8 * uVar138) |
               !bVar66 * auVar130._12_4_;
          bVar66 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar66 * ((uint)bVar9 * auVar98._16_4_ | !bVar9 * uVar139) |
               !bVar66 * auVar130._16_4_;
          bVar66 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar66 * ((uint)bVar10 * auVar98._20_4_ | !bVar10 * uVar140) |
               !bVar66 * auVar130._20_4_;
          bVar66 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar66 * ((uint)bVar11 * auVar98._24_4_ | !bVar11 * uVar141) |
               !bVar66 * auVar130._24_4_;
          bVar66 = SUB81(uVar68 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar66 * ((uint)bVar12 * auVar98._28_4_ | !bVar12 * uVar142) |
               !bVar66 * auVar130._28_4_;
          bVar55 = (~bVar61 | bVar63) & bVar55;
        }
      }
      auVar233._0_4_ = local_620._0_4_ * auVar225._0_4_;
      auVar233._4_4_ = local_620._4_4_ * auVar225._4_4_;
      auVar233._8_4_ = local_620._8_4_ * auVar225._8_4_;
      auVar233._12_4_ = local_620._12_4_ * auVar225._12_4_;
      auVar233._16_4_ = local_620._16_4_ * auVar225._16_4_;
      auVar233._20_4_ = local_620._20_4_ * auVar225._20_4_;
      auVar233._28_36_ = auVar225._28_36_;
      auVar233._24_4_ = local_620._24_4_ * auVar225._24_4_;
      auVar70 = vfmadd231ps_fma(auVar233._0_32_,local_540,auVar97);
      auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),_local_520,auVar102);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(ZEXT1632(auVar70),auVar237);
      _local_1c0 = auVar84;
      auVar232._8_4_ = 0x3e99999a;
      auVar232._0_8_ = 0x3e99999a3e99999a;
      auVar232._12_4_ = 0x3e99999a;
      auVar232._16_4_ = 0x3e99999a;
      auVar232._20_4_ = 0x3e99999a;
      auVar232._24_4_ = 0x3e99999a;
      auVar232._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar97,auVar232,1);
      local_500._0_2_ = (short)uVar17;
      local_320 = vmaxps_avx(auVar84,auVar130);
      auVar97 = vminps_avx(local_300,auVar129);
      uVar17 = vcmpps_avx512vl(auVar84,auVar97,2);
      bVar61 = (byte)uVar17 & bVar53;
      uVar18 = vcmpps_avx512vl(local_320,local_300,2);
      if ((bVar53 & ((byte)uVar18 | (byte)uVar17)) == 0) {
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar225 = ZEXT3264(local_6c0);
      }
      else {
        auVar48._4_4_ = local_620._4_4_ * auVar245._4_4_;
        auVar48._0_4_ = local_620._0_4_ * auVar245._0_4_;
        auVar48._8_4_ = local_620._8_4_ * auVar245._8_4_;
        auVar48._12_4_ = local_620._12_4_ * auVar245._12_4_;
        auVar48._16_4_ = local_620._16_4_ * auVar245._16_4_;
        auVar48._20_4_ = local_620._20_4_ * auVar245._20_4_;
        auVar48._24_4_ = local_620._24_4_ * auVar245._24_4_;
        auVar48._28_4_ = auVar97._28_4_;
        auVar70 = vfmadd213ps_fma(auVar103,local_540,auVar48);
        auVar70 = vfmadd213ps_fma(auVar83,_local_520,ZEXT1632(auVar70));
        auVar83 = vandps_avx(ZEXT1632(auVar70),auVar237);
        uVar17 = vcmpps_avx512vl(auVar83,auVar232,1);
        bVar63 = (byte)uVar17 | ~bVar55;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar152,auVar33);
        local_2c0._0_4_ = (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar66 = (bool)(bVar63 >> 1 & 1);
        local_2c0._4_4_ = (uint)bVar66 * auVar83._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar63 >> 2 & 1);
        local_2c0._8_4_ = (uint)bVar66 * auVar83._8_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar63 >> 3 & 1);
        local_2c0._12_4_ = (uint)bVar66 * auVar83._12_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar63 >> 4 & 1);
        local_2c0._16_4_ = (uint)bVar66 * auVar83._16_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar63 >> 5 & 1);
        local_2c0._20_4_ = (uint)bVar66 * auVar83._20_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar63 >> 6 & 1);
        local_2c0._24_4_ = (uint)bVar66 * auVar83._24_4_ | (uint)!bVar66 * 2;
        local_2c0._28_4_ = (uint)(bVar63 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_4a0,local_2c0,5);
        bVar63 = (byte)uVar17 & bVar61;
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        if (bVar63 == 0) {
          auVar154._4_4_ = uVar69;
          auVar154._0_4_ = uVar69;
          auVar154._8_4_ = uVar69;
          auVar154._12_4_ = uVar69;
          auVar154._16_4_ = uVar69;
          auVar154._20_4_ = uVar69;
          auVar154._24_4_ = uVar69;
          auVar154._28_4_ = uVar69;
          auVar83 = local_320;
        }
        else {
          local_2e0 = local_320;
          auVar73 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar70 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar1 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar74 = vminps_avx(auVar73,auVar1);
          auVar73 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar1 = vmaxps_avx(auVar70,auVar73);
          auVar82._8_4_ = 0x7fffffff;
          auVar82._0_8_ = 0x7fffffff7fffffff;
          auVar82._12_4_ = 0x7fffffff;
          auVar70 = vandps_avx(auVar74,auVar82);
          auVar73 = vandps_avx(auVar1,auVar82);
          auVar70 = vmaxps_avx(auVar70,auVar73);
          auVar73 = vmovshdup_avx(auVar70);
          auVar73 = vmaxss_avx(auVar73,auVar70);
          auVar70 = vshufpd_avx(auVar70,auVar70,1);
          auVar70 = vmaxss_avx(auVar70,auVar73);
          fVar157 = auVar70._0_4_ * 1.9073486e-06;
          local_720 = vshufps_avx(auVar1,auVar1,0xff);
          local_a80 = auVar84._0_4_;
          fStack_a7c = auVar84._4_4_;
          fStack_a78 = auVar84._8_4_;
          fStack_a74 = auVar84._12_4_;
          fStack_a70 = auVar84._16_4_;
          fStack_a6c = auVar84._20_4_;
          fStack_a68 = auVar84._24_4_;
          fStack_a64 = auVar84._28_4_;
          local_4e0 = local_a80 + fVar143;
          fStack_4dc = fStack_a7c + fVar143;
          fStack_4d8 = fStack_a78 + fVar143;
          fStack_4d4 = fStack_a74 + fVar143;
          fStack_4d0 = fStack_a70 + fVar143;
          fStack_4cc = fStack_a6c + fVar143;
          fStack_4c8 = fStack_a68 + fVar143;
          fStack_4c4 = fStack_a64 + fVar143;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar83 = vblendmps_avx512vl(auVar153,auVar84);
            auVar132._0_4_ =
                 (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar66 * auVar83._4_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar66 * auVar83._8_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar66 * auVar83._12_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar66 * auVar83._16_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar66 * auVar83._20_4_ | (uint)!bVar66 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar63 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar83 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar83 = vminps_avx(auVar132,auVar83);
            auVar97 = vshufpd_avx(auVar83,auVar83,5);
            auVar83 = vminps_avx(auVar83,auVar97);
            auVar97 = vpermpd_avx2(auVar83,0x4e);
            auVar83 = vminps_avx(auVar83,auVar97);
            uVar17 = vcmpps_avx512vl(auVar132,auVar83,0);
            bVar54 = (byte)uVar17 & bVar63;
            bVar56 = bVar63;
            if (bVar54 != 0) {
              bVar56 = bVar54;
            }
            iVar20 = 0;
            for (uVar69 = (uint)bVar56; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar69 = *(uint *)(local_1e0 + (uint)(iVar20 << 2));
            uVar57 = *(uint *)(local_1c0 + (uint)(iVar20 << 2));
            fVar170 = auVar14._0_4_;
            if ((float)local_7c0._0_4_ < 0.0) {
              fVar170 = sqrtf((float)local_7c0._0_4_);
            }
            auVar70 = vinsertps_avx(ZEXT416(uVar57),ZEXT416(uVar69),0x10);
            bVar66 = true;
            uVar68 = 0;
            do {
              uVar158 = auVar70._0_4_;
              auVar144._4_4_ = uVar158;
              auVar144._0_4_ = uVar158;
              auVar144._8_4_ = uVar158;
              auVar144._12_4_ = uVar158;
              auVar1 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_7b0);
              auVar73 = vmovshdup_avx(auVar70);
              local_5a0._0_16_ = auVar73;
              fVar202 = 1.0 - auVar73._0_4_;
              auVar73 = vshufps_avx(auVar70,auVar70,0x55);
              fVar171 = auVar73._0_4_;
              auVar177._0_4_ = local_680._0_4_ * fVar171;
              fVar172 = auVar73._4_4_;
              auVar177._4_4_ = local_680._4_4_ * fVar172;
              fVar174 = auVar73._8_4_;
              auVar177._8_4_ = local_680._8_4_ * fVar174;
              fVar173 = auVar73._12_4_;
              auVar177._12_4_ = local_680._12_4_ * fVar173;
              _local_580 = ZEXT416((uint)fVar202);
              auVar204._4_4_ = fVar202;
              auVar204._0_4_ = fVar202;
              auVar204._8_4_ = fVar202;
              auVar204._12_4_ = fVar202;
              auVar73 = vfmadd231ps_fma(auVar177,auVar204,local_640._0_16_);
              auVar217._0_4_ = local_660._0_4_ * fVar171;
              auVar217._4_4_ = local_660._4_4_ * fVar172;
              auVar217._8_4_ = local_660._8_4_ * fVar174;
              auVar217._12_4_ = local_660._12_4_ * fVar173;
              auVar74 = vfmadd231ps_fma(auVar217,auVar204,local_680._0_16_);
              auVar226._0_4_ = fVar171 * (float)local_6a0._0_4_;
              auVar226._4_4_ = fVar172 * (float)local_6a0._4_4_;
              auVar226._8_4_ = fVar174 * fStack_698;
              auVar226._12_4_ = fVar173 * fStack_694;
              auVar75 = vfmadd231ps_fma(auVar226,auVar204,local_660._0_16_);
              auVar234._0_4_ = fVar171 * auVar74._0_4_;
              auVar234._4_4_ = fVar172 * auVar74._4_4_;
              auVar234._8_4_ = fVar174 * auVar74._8_4_;
              auVar234._12_4_ = fVar173 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar234,auVar204,auVar73);
              auVar178._0_4_ = fVar171 * auVar75._0_4_;
              auVar178._4_4_ = fVar172 * auVar75._4_4_;
              auVar178._8_4_ = fVar174 * auVar75._8_4_;
              auVar178._12_4_ = fVar173 * auVar75._12_4_;
              auVar74 = vfmadd231ps_fma(auVar178,auVar204,auVar74);
              auVar218._0_4_ = fVar171 * auVar74._0_4_;
              auVar218._4_4_ = fVar172 * auVar74._4_4_;
              auVar218._8_4_ = fVar174 * auVar74._8_4_;
              auVar218._12_4_ = fVar173 * auVar74._12_4_;
              auVar75 = vfmadd231ps_fma(auVar218,auVar73,auVar204);
              auVar73 = vsubps_avx(auVar74,auVar73);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar74 = vmulps_avx512vl(auVar73,auVar21);
              local_560._0_16_ = auVar75;
              auVar1 = vsubps_avx(auVar1,auVar75);
              auVar73 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar171 = auVar73._0_4_;
              local_780 = ZEXT1632(auVar70);
              if (fVar171 < 0.0) {
                auVar225._0_4_ = sqrtf(fVar171);
                auVar225._4_60_ = extraout_var;
                auVar70 = auVar225._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar73,auVar73);
              }
              local_5c0._0_16_ = vdpps_avx(auVar74,auVar74,0x7f);
              fVar172 = local_5c0._0_4_;
              auVar179._4_12_ = ZEXT812(0) << 0x20;
              auVar179._0_4_ = fVar172;
              local_7e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              fVar174 = local_7e0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(local_5c0._0_16_,auVar22);
              auVar75 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar75._0_4_;
              local_7a0._0_4_ = auVar70._0_4_;
              if (fVar172 < auVar71._0_4_) {
                fVar173 = sqrtf(fVar172);
                auVar70 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar75 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar173 = auVar75._0_4_;
              }
              fVar202 = local_7e0._0_4_;
              fVar172 = fVar174 * 1.5 + fVar172 * -0.5 * fVar202 * fVar202 * fVar202;
              auVar145._0_4_ = auVar74._0_4_ * fVar172;
              auVar145._4_4_ = auVar74._4_4_ * fVar172;
              auVar145._8_4_ = auVar74._8_4_ * fVar172;
              auVar145._12_4_ = auVar74._12_4_ * fVar172;
              local_7e0._0_16_ = vdpps_avx(auVar1,auVar145,0x7f);
              auVar71 = vaddss_avx512f(auVar70,ZEXT416(0x3f800000));
              auVar146._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar146._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar146._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar146._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar73 = vsubps_avx(auVar73,auVar146);
              fVar174 = auVar73._0_4_;
              auVar160._4_12_ = ZEXT812(0) << 0x20;
              auVar160._0_4_ = fVar174;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
              auVar76 = vmulss_avx512f(auVar75,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
              uVar67 = fVar174 == 0.0;
              uVar65 = fVar174 < 0.0;
              if ((bool)uVar65) {
                local_6e0._0_4_ = fVar173;
                local_700._0_4_ = auVar76._0_4_;
                local_710._4_4_ = fVar172;
                local_710._0_4_ = fVar172;
                fStack_708 = fVar172;
                fStack_704 = fVar172;
                local_6f0 = auVar75;
                fVar174 = sqrtf(fVar174);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar76 = ZEXT416((uint)local_700._0_4_);
                auVar70 = ZEXT416((uint)local_7a0._0_4_);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar75 = local_6f0;
                fVar172 = (float)local_710._0_4_;
                fVar202 = (float)local_710._4_4_;
                fVar175 = fStack_708;
                fVar249 = fStack_704;
                fVar173 = (float)local_6e0._0_4_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar174 = auVar73._0_4_;
                fVar202 = fVar172;
                fVar175 = fVar172;
                fVar249 = fVar172;
              }
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar176 = auVar73._0_4_ * 6.0;
              fVar15 = local_5a0._0_4_ * 6.0;
              auVar205._0_4_ = fVar15 * (float)local_6a0._0_4_;
              auVar205._4_4_ = fVar15 * (float)local_6a0._4_4_;
              auVar205._8_4_ = fVar15 * fStack_698;
              auVar205._12_4_ = fVar15 * fStack_694;
              auVar180._4_4_ = fVar176;
              auVar180._0_4_ = fVar176;
              auVar180._8_4_ = fVar176;
              auVar180._12_4_ = fVar176;
              auVar73 = vfmadd132ps_fma(auVar180,auVar205,local_660._0_16_);
              fVar176 = auVar79._0_4_ * 6.0;
              auVar161._4_4_ = fVar176;
              auVar161._0_4_ = fVar176;
              auVar161._8_4_ = fVar176;
              auVar161._12_4_ = fVar176;
              auVar73 = vfmadd132ps_fma(auVar161,auVar73,local_680._0_16_);
              fVar176 = local_580._0_4_ * 6.0;
              auVar181._4_4_ = fVar176;
              auVar181._0_4_ = fVar176;
              auVar181._8_4_ = fVar176;
              auVar181._12_4_ = fVar176;
              auVar73 = vfmadd132ps_fma(auVar181,auVar73,local_640._0_16_);
              auVar162._0_4_ = auVar73._0_4_ * (float)local_5c0._0_4_;
              auVar162._4_4_ = auVar73._4_4_ * (float)local_5c0._0_4_;
              auVar162._8_4_ = auVar73._8_4_ * (float)local_5c0._0_4_;
              auVar162._12_4_ = auVar73._12_4_ * (float)local_5c0._0_4_;
              auVar73 = vdpps_avx(auVar74,auVar73,0x7f);
              fVar176 = auVar73._0_4_;
              auVar182._0_4_ = auVar74._0_4_ * fVar176;
              auVar182._4_4_ = auVar74._4_4_ * fVar176;
              auVar182._8_4_ = auVar74._8_4_ * fVar176;
              auVar182._12_4_ = auVar74._12_4_ * fVar176;
              auVar73 = vsubps_avx(auVar162,auVar182);
              fVar176 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar157),
                                   ZEXT416((uint)(local_780._0_4_ * fVar170 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar74,auVar23);
              auVar183._0_4_ = fVar172 * auVar73._0_4_ * fVar176;
              auVar183._4_4_ = fVar202 * auVar73._4_4_ * fVar176;
              auVar183._8_4_ = fVar175 * auVar73._8_4_ * fVar176;
              auVar183._12_4_ = fVar249 * auVar73._12_4_ * fVar176;
              auVar248 = ZEXT1664(auVar145);
              auVar73 = vdpps_avx(auVar78,auVar145,0x7f);
              auVar80 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar157),auVar79);
              auVar70 = vdpps_avx(auVar1,auVar183,0x7f);
              vfmadd213ss_avx512f(auVar71,ZEXT416((uint)(fVar157 / fVar173)),auVar80);
              fVar172 = auVar73._0_4_ + auVar70._0_4_;
              auVar70 = vdpps_avx(local_7b0,auVar145,0x7f);
              auVar73 = vdpps_avx(auVar1,auVar78,0x7f);
              auVar71 = vmulss_avx512f(auVar77,auVar75);
              auVar75 = vmulss_avx512f(auVar75,auVar75);
              auVar76 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar71._0_4_ * auVar75._0_4_)));
              auVar75 = vdpps_avx(auVar1,local_7b0,0x7f);
              auVar77 = vfnmadd231ss_avx512f(auVar73,local_7e0._0_16_,ZEXT416((uint)fVar172));
              auVar75 = vfnmadd231ss_avx512f(auVar75,local_7e0._0_16_,auVar70);
              auVar73 = vpermilps_avx(local_560._0_16_,0xff);
              fVar174 = fVar174 - auVar73._0_4_;
              auVar71 = vshufps_avx(auVar74,auVar74,0xff);
              auVar73 = vfmsub213ss_fma(auVar77,auVar76,auVar71);
              auVar238._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar238._8_4_ = auVar73._8_4_ ^ 0x80000000;
              auVar238._12_4_ = auVar73._12_4_ ^ 0x80000000;
              auVar75 = ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_));
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar172),auVar75);
              auVar73 = vinsertps_avx(auVar238,auVar75,0x1c);
              auVar227._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar70._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar75 = vinsertps_avx(ZEXT416((uint)fVar172),auVar227,0x10);
              auVar206._0_4_ = auVar76._0_4_;
              auVar206._4_4_ = auVar206._0_4_;
              auVar206._8_4_ = auVar206._0_4_;
              auVar206._12_4_ = auVar206._0_4_;
              auVar70 = vdivps_avx(auVar73,auVar206);
              auVar73 = vdivps_avx(auVar75,auVar206);
              auVar75 = vbroadcastss_avx512vl(local_7e0._0_16_);
              auVar207._0_4_ = auVar75._0_4_ * auVar70._0_4_ + fVar174 * auVar73._0_4_;
              auVar207._4_4_ = auVar75._4_4_ * auVar70._4_4_ + fVar174 * auVar73._4_4_;
              auVar207._8_4_ = auVar75._8_4_ * auVar70._8_4_ + fVar174 * auVar73._8_4_;
              auVar207._12_4_ = auVar75._12_4_ * auVar70._12_4_ + fVar174 * auVar73._12_4_;
              auVar70 = vsubps_avx(local_780._0_16_,auVar207);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(local_7e0._0_16_,auVar24);
              auVar73 = vucomiss_avx512f(auVar73);
              if (!(bool)uVar65 && !(bool)uVar67) {
                auVar73 = vaddss_avx512f(auVar79,auVar73);
                auVar73 = vfmadd231ss_fma(auVar73,local_720,ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(ZEXT416((uint)fVar174),auVar25);
                if (auVar75._0_4_ < auVar73._0_4_) {
                  fVar170 = auVar70._0_4_ + (float)local_730._0_4_;
                  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar170 < fVar203) {
LAB_01ce371e:
                    bVar56 = 0;
                    goto LAB_01ce3748;
                  }
                  fVar172 = *(float *)(ray + k * 4 + 0x100);
                  if (fVar170 <= fVar172) {
                    auVar73 = vmovshdup_avx(auVar70);
                    bVar56 = 0;
                    if ((auVar73._0_4_ < 0.0) || (1.0 < auVar73._0_4_)) goto LAB_01ce3748;
                    auVar208._0_12_ = ZEXT812(0);
                    auVar208._12_4_ = 0;
                    auVar184._4_8_ = auVar208._4_8_;
                    auVar184._0_4_ = fVar171;
                    auVar184._12_4_ = 0;
                    auVar73 = vrsqrt14ss_avx512f(auVar208,auVar184);
                    fVar174 = auVar73._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar64].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01ce371e;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar56 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ce3748;
                    fVar171 = fVar174 * 1.5 + fVar171 * -0.5 * fVar174 * fVar174 * fVar174;
                    auVar185._0_4_ = auVar1._0_4_ * fVar171;
                    auVar185._4_4_ = auVar1._4_4_ * fVar171;
                    auVar185._8_4_ = auVar1._8_4_ * fVar171;
                    auVar185._12_4_ = auVar1._12_4_ * fVar171;
                    auVar75 = vfmadd213ps_fma(auVar71,auVar185,auVar74);
                    auVar73 = vshufps_avx(auVar185,auVar185,0xc9);
                    auVar1 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar186._0_4_ = auVar185._0_4_ * auVar1._0_4_;
                    auVar186._4_4_ = auVar185._4_4_ * auVar1._4_4_;
                    auVar186._8_4_ = auVar185._8_4_ * auVar1._8_4_;
                    auVar186._12_4_ = auVar185._12_4_ * auVar1._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar186,auVar74,auVar73);
                    auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar1 = vshufps_avx(auVar75,auVar75,0xc9);
                    auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                    auVar147._0_4_ = auVar75._0_4_ * auVar74._0_4_;
                    auVar147._4_4_ = auVar75._4_4_ * auVar74._4_4_;
                    auVar147._8_4_ = auVar75._8_4_ * auVar74._8_4_;
                    auVar147._12_4_ = auVar75._12_4_ * auVar74._12_4_;
                    auVar73 = vfmsub231ps_fma(auVar147,auVar73,auVar1);
                    auVar215._8_4_ = 1;
                    auVar215._0_8_ = 0x100000001;
                    auVar215._12_4_ = 1;
                    auVar215._16_4_ = 1;
                    auVar215._20_4_ = 1;
                    auVar215._24_4_ = 1;
                    auVar215._28_4_ = 1;
                    local_3e0 = vpermps_avx2(auVar215,ZEXT1632(auVar70));
                    auVar83 = vpermps_avx2(auVar215,ZEXT1632(auVar73));
                    auVar223._8_4_ = 2;
                    auVar223._0_8_ = 0x200000002;
                    auVar223._12_4_ = 2;
                    auVar223._16_4_ = 2;
                    auVar223._20_4_ = 2;
                    auVar223._24_4_ = 2;
                    auVar223._28_4_ = 2;
                    local_420 = vpermps_avx2(auVar223,ZEXT1632(auVar73));
                    local_400 = auVar73._0_4_;
                    local_440[0] = (RTCHitN)auVar83[0];
                    local_440[1] = (RTCHitN)auVar83[1];
                    local_440[2] = (RTCHitN)auVar83[2];
                    local_440[3] = (RTCHitN)auVar83[3];
                    local_440[4] = (RTCHitN)auVar83[4];
                    local_440[5] = (RTCHitN)auVar83[5];
                    local_440[6] = (RTCHitN)auVar83[6];
                    local_440[7] = (RTCHitN)auVar83[7];
                    local_440[8] = (RTCHitN)auVar83[8];
                    local_440[9] = (RTCHitN)auVar83[9];
                    local_440[10] = (RTCHitN)auVar83[10];
                    local_440[0xb] = (RTCHitN)auVar83[0xb];
                    local_440[0xc] = (RTCHitN)auVar83[0xc];
                    local_440[0xd] = (RTCHitN)auVar83[0xd];
                    local_440[0xe] = (RTCHitN)auVar83[0xe];
                    local_440[0xf] = (RTCHitN)auVar83[0xf];
                    local_440[0x10] = (RTCHitN)auVar83[0x10];
                    local_440[0x11] = (RTCHitN)auVar83[0x11];
                    local_440[0x12] = (RTCHitN)auVar83[0x12];
                    local_440[0x13] = (RTCHitN)auVar83[0x13];
                    local_440[0x14] = (RTCHitN)auVar83[0x14];
                    local_440[0x15] = (RTCHitN)auVar83[0x15];
                    local_440[0x16] = (RTCHitN)auVar83[0x16];
                    local_440[0x17] = (RTCHitN)auVar83[0x17];
                    local_440[0x18] = (RTCHitN)auVar83[0x18];
                    local_440[0x19] = (RTCHitN)auVar83[0x19];
                    local_440[0x1a] = (RTCHitN)auVar83[0x1a];
                    local_440[0x1b] = (RTCHitN)auVar83[0x1b];
                    local_440[0x1c] = (RTCHitN)auVar83[0x1c];
                    local_440[0x1d] = (RTCHitN)auVar83[0x1d];
                    local_440[0x1e] = (RTCHitN)auVar83[0x1e];
                    local_440[0x1f] = (RTCHitN)auVar83[0x1f];
                    uStack_3fc = local_400;
                    uStack_3f8 = local_400;
                    uStack_3f4 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3ec = local_400;
                    uStack_3e8 = local_400;
                    uStack_3e4 = local_400;
                    local_3c0 = ZEXT432(0) << 0x20;
                    local_3a0 = local_460._0_8_;
                    uStack_398 = local_460._8_8_;
                    uStack_390 = local_460._16_8_;
                    uStack_388 = local_460._24_8_;
                    local_380 = local_480;
                    vpcmpeqd_avx2(local_480,local_480);
                    local_360 = context->user->instID[0];
                    uStack_35c = local_360;
                    uStack_358 = local_360;
                    uStack_354 = local_360;
                    uStack_350 = local_360;
                    uStack_34c = local_360;
                    uStack_348 = local_360;
                    uStack_344 = local_360;
                    local_340 = context->user->instPrimID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    *(float *)(ray + k * 4 + 0x100) = fVar170;
                    local_760 = local_4c0;
                    local_810.valid = (int *)local_760;
                    local_810.geometryUserPtr = pGVar3->userPtr;
                    local_810.context = context->user;
                    local_810.hit = local_440;
                    local_810.N = 8;
                    local_810.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar248 = ZEXT1664(auVar145);
                      (*pGVar3->occlusionFilterN)(&local_810);
                      auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                    }
                    if (local_760 != (undefined1  [32])0x0) {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        (*p_Var5)(&local_810);
                        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      uVar68 = vptestmd_avx512vl(local_760,local_760);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar6 = (bool)((byte)uVar68 & 1);
                      bVar7 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar68 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
                      bVar13 = SUB81(uVar68 >> 7,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)bVar6 * auVar83._0_4_ |
                           (uint)!bVar6 * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar7 * auVar83._4_4_ |
                           (uint)!bVar7 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar8 * auVar83._8_4_ |
                           (uint)!bVar8 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar9 * auVar83._12_4_ |
                           (uint)!bVar9 * *(int *)(local_810.ray + 0x10c);
                      *(uint *)(local_810.ray + 0x110) =
                           (uint)bVar10 * auVar83._16_4_ |
                           (uint)!bVar10 * *(int *)(local_810.ray + 0x110);
                      *(uint *)(local_810.ray + 0x114) =
                           (uint)bVar11 * auVar83._20_4_ |
                           (uint)!bVar11 * *(int *)(local_810.ray + 0x114);
                      *(uint *)(local_810.ray + 0x118) =
                           (uint)bVar12 * auVar83._24_4_ |
                           (uint)!bVar12 * *(int *)(local_810.ray + 0x118);
                      *(uint *)(local_810.ray + 0x11c) =
                           (uint)bVar13 * auVar83._28_4_ |
                           (uint)!bVar13 * *(int *)(local_810.ray + 0x11c);
                      bVar56 = 1;
                      if (local_760 != (undefined1  [32])0x0) goto LAB_01ce3748;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar172;
                  }
                  bVar56 = 0;
                  goto LAB_01ce3748;
                }
              }
              bVar66 = uVar68 < 4;
              uVar68 = uVar68 + 1;
            } while (uVar68 != 5);
            bVar66 = false;
            auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar56 = 5;
LAB_01ce3748:
            bVar62 = (bool)(bVar62 | bVar66 & bVar56);
            uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar154._4_4_ = uVar158;
            auVar154._0_4_ = uVar158;
            auVar154._8_4_ = uVar158;
            auVar154._12_4_ = uVar158;
            auVar154._16_4_ = uVar158;
            auVar154._20_4_ = uVar158;
            auVar154._24_4_ = uVar158;
            auVar154._28_4_ = uVar158;
            auVar50._4_4_ = fStack_4dc;
            auVar50._0_4_ = local_4e0;
            auVar50._8_4_ = fStack_4d8;
            auVar50._12_4_ = fStack_4d4;
            auVar50._16_4_ = fStack_4d0;
            auVar50._20_4_ = fStack_4cc;
            auVar50._24_4_ = fStack_4c8;
            auVar50._28_4_ = fStack_4c4;
            uVar17 = vcmpps_avx512vl(auVar154,auVar50,0xd);
            bVar63 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar63 & (byte)uVar17;
            auVar83 = local_2e0;
          } while (bVar63 != 0);
        }
        auVar84 = local_320;
        bVar55 = local_500[0] | ~bVar55;
        auVar168._0_4_ = fVar143 + auVar83._0_4_;
        auVar168._4_4_ = fVar143 + auVar83._4_4_;
        auVar168._8_4_ = fVar143 + auVar83._8_4_;
        auVar168._12_4_ = fVar143 + auVar83._12_4_;
        auVar168._16_4_ = fVar143 + auVar83._16_4_;
        auVar168._20_4_ = fVar143 + auVar83._20_4_;
        auVar168._24_4_ = fVar143 + auVar83._24_4_;
        auVar168._28_4_ = fVar143 + auVar83._28_4_;
        uVar17 = vcmpps_avx512vl(auVar168,auVar154,2);
        bVar53 = (byte)uVar18 & bVar53 & (byte)uVar17;
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar169,auVar34);
        auVar133._0_4_ = (uint)(bVar55 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar66 = (bool)(bVar55 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar66 * auVar83._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar55 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar66 * auVar83._8_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar55 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar66 * auVar83._12_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar55 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar66 * auVar83._16_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar55 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar66 * auVar83._20_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar55 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar66 * auVar83._24_4_ | (uint)!bVar66 * 2;
        auVar133._28_4_ = (uint)(bVar55 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2;
        uVar17 = vpcmpd_avx512vl(local_4a0,auVar133,5);
        bVar55 = (byte)uVar17 & bVar53;
        if (bVar55 != 0) {
          auVar73 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar70 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar1 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar74 = vminps_avx(auVar73,auVar1);
          auVar73 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar1 = vmaxps_avx(auVar70,auVar73);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar70 = vandps_avx(auVar74,auVar187);
          auVar73 = vandps_avx(auVar1,auVar187);
          auVar70 = vmaxps_avx(auVar70,auVar73);
          auVar73 = vmovshdup_avx(auVar70);
          auVar73 = vmaxss_avx(auVar73,auVar70);
          auVar70 = vshufpd_avx(auVar70,auVar70,1);
          auVar70 = vmaxss_avx(auVar70,auVar73);
          fVar157 = auVar70._0_4_ * 1.9073486e-06;
          local_720 = vshufps_avx(auVar1,auVar1,0xff);
          local_4e0 = fVar143 + local_320._0_4_;
          fStack_4dc = fVar143 + local_320._4_4_;
          fStack_4d8 = fVar143 + local_320._8_4_;
          fStack_4d4 = fVar143 + local_320._12_4_;
          fStack_4d0 = fVar143 + local_320._16_4_;
          fStack_4cc = fVar143 + local_320._20_4_;
          fStack_4c8 = fVar143 + local_320._24_4_;
          fStack_4c4 = fVar143 + local_320._28_4_;
          local_500 = auVar133;
          do {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar83 = vblendmps_avx512vl(auVar155,auVar84);
            auVar134._0_4_ =
                 (uint)(bVar55 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
            bVar66 = (bool)(bVar55 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar66 * auVar83._4_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar55 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar66 * auVar83._8_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar55 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar66 * auVar83._12_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar55 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar66 * auVar83._16_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar55 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar66 * auVar83._20_4_ | (uint)!bVar66 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar55 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar55 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar83 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar83 = vminps_avx(auVar134,auVar83);
            auVar97 = vshufpd_avx(auVar83,auVar83,5);
            auVar83 = vminps_avx(auVar83,auVar97);
            auVar97 = vpermpd_avx2(auVar83,0x4e);
            auVar83 = vminps_avx(auVar83,auVar97);
            uVar17 = vcmpps_avx512vl(auVar134,auVar83,0);
            bVar56 = (byte)uVar17 & bVar55;
            bVar63 = bVar55;
            if (bVar56 != 0) {
              bVar63 = bVar56;
            }
            iVar20 = 0;
            for (uVar69 = (uint)bVar63; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar69 = *(uint *)(local_200 + (uint)(iVar20 << 2));
            uVar57 = *(uint *)(local_300 + (uint)(iVar20 << 2));
            fVar170 = auVar72._0_4_;
            if ((float)local_7c0._0_4_ < 0.0) {
              fVar170 = sqrtf((float)local_7c0._0_4_);
            }
            auVar70 = vinsertps_avx(ZEXT416(uVar57),ZEXT416(uVar69),0x10);
            bVar66 = true;
            uVar68 = 0;
            do {
              uVar158 = auVar70._0_4_;
              auVar148._4_4_ = uVar158;
              auVar148._0_4_ = uVar158;
              auVar148._8_4_ = uVar158;
              auVar148._12_4_ = uVar158;
              auVar1 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_7b0);
              auVar73 = vmovshdup_avx(auVar70);
              local_5a0._0_16_ = auVar73;
              fVar202 = 1.0 - auVar73._0_4_;
              auVar73 = vshufps_avx(auVar70,auVar70,0x55);
              fVar171 = auVar73._0_4_;
              auVar188._0_4_ = local_680._0_4_ * fVar171;
              fVar172 = auVar73._4_4_;
              auVar188._4_4_ = local_680._4_4_ * fVar172;
              fVar174 = auVar73._8_4_;
              auVar188._8_4_ = local_680._8_4_ * fVar174;
              fVar173 = auVar73._12_4_;
              auVar188._12_4_ = local_680._12_4_ * fVar173;
              _local_580 = ZEXT416((uint)fVar202);
              auVar209._4_4_ = fVar202;
              auVar209._0_4_ = fVar202;
              auVar209._8_4_ = fVar202;
              auVar209._12_4_ = fVar202;
              auVar73 = vfmadd231ps_fma(auVar188,auVar209,local_640._0_16_);
              auVar219._0_4_ = local_660._0_4_ * fVar171;
              auVar219._4_4_ = local_660._4_4_ * fVar172;
              auVar219._8_4_ = local_660._8_4_ * fVar174;
              auVar219._12_4_ = local_660._12_4_ * fVar173;
              auVar74 = vfmadd231ps_fma(auVar219,auVar209,local_680._0_16_);
              auVar228._0_4_ = fVar171 * (float)local_6a0._0_4_;
              auVar228._4_4_ = fVar172 * (float)local_6a0._4_4_;
              auVar228._8_4_ = fVar174 * fStack_698;
              auVar228._12_4_ = fVar173 * fStack_694;
              auVar75 = vfmadd231ps_fma(auVar228,auVar209,local_660._0_16_);
              auVar235._0_4_ = fVar171 * auVar74._0_4_;
              auVar235._4_4_ = fVar172 * auVar74._4_4_;
              auVar235._8_4_ = fVar174 * auVar74._8_4_;
              auVar235._12_4_ = fVar173 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar235,auVar209,auVar73);
              auVar189._0_4_ = fVar171 * auVar75._0_4_;
              auVar189._4_4_ = fVar172 * auVar75._4_4_;
              auVar189._8_4_ = fVar174 * auVar75._8_4_;
              auVar189._12_4_ = fVar173 * auVar75._12_4_;
              auVar74 = vfmadd231ps_fma(auVar189,auVar209,auVar74);
              auVar220._0_4_ = fVar171 * auVar74._0_4_;
              auVar220._4_4_ = fVar172 * auVar74._4_4_;
              auVar220._8_4_ = fVar174 * auVar74._8_4_;
              auVar220._12_4_ = fVar173 * auVar74._12_4_;
              auVar75 = vfmadd231ps_fma(auVar220,auVar73,auVar209);
              auVar73 = vsubps_avx(auVar74,auVar73);
              auVar26._8_4_ = 0x40400000;
              auVar26._0_8_ = 0x4040000040400000;
              auVar26._12_4_ = 0x40400000;
              auVar74 = vmulps_avx512vl(auVar73,auVar26);
              local_560._0_16_ = auVar75;
              auVar1 = vsubps_avx(auVar1,auVar75);
              auVar73 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar171 = auVar73._0_4_;
              local_780 = ZEXT1632(auVar70);
              if (fVar171 < 0.0) {
                auVar156._0_4_ = sqrtf(fVar171);
                auVar156._4_60_ = extraout_var_00;
                auVar70 = auVar156._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar73,auVar73);
              }
              local_5c0._0_16_ = vdpps_avx(auVar74,auVar74,0x7f);
              fVar172 = local_5c0._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar172;
              local_7e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar174 = local_7e0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(local_5c0._0_16_,auVar27);
              auVar75 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar75._0_4_;
              local_7a0._0_4_ = auVar70._0_4_;
              if (fVar172 < auVar71._0_4_) {
                fVar173 = sqrtf(fVar172);
                auVar70 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar75 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar173 = auVar75._0_4_;
              }
              fVar202 = local_7e0._0_4_;
              auVar71 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar174 * 1.5 +
                                                 fVar172 * -0.5 * fVar202 * fVar202 * fVar202)));
              auVar75 = vmulps_avx512vl(auVar74,auVar71);
              local_7e0._0_16_ = vdpps_avx(auVar1,auVar75,0x7f);
              auVar77 = vaddss_avx512f(auVar70,ZEXT416(0x3f800000));
              auVar149._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar149._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar149._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar149._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar73 = vsubps_avx(auVar73,auVar149);
              fVar172 = auVar73._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar172;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              auVar79 = vmulss_avx512f(auVar76,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
              uVar67 = fVar172 == 0.0;
              uVar65 = fVar172 < 0.0;
              if ((bool)uVar65) {
                local_6f0._0_4_ = auVar79._0_4_;
                _local_710 = auVar71;
                local_700 = auVar75;
                local_6e0 = auVar76;
                fVar172 = sqrtf(fVar172);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar79 = ZEXT416((uint)local_6f0._0_4_);
                auVar70 = ZEXT416((uint)local_7a0._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar75 = local_700;
                auVar76 = local_6e0;
                auVar71 = _local_710;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar172 = auVar73._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar71);
              auVar248 = ZEXT1664(auVar75);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar174 = auVar73._0_4_ * 6.0;
              fVar202 = local_5a0._0_4_ * 6.0;
              auVar210._0_4_ = fVar202 * (float)local_6a0._0_4_;
              auVar210._4_4_ = fVar202 * (float)local_6a0._4_4_;
              auVar210._8_4_ = fVar202 * fStack_698;
              auVar210._12_4_ = fVar202 * fStack_694;
              auVar191._4_4_ = fVar174;
              auVar191._0_4_ = fVar174;
              auVar191._8_4_ = fVar174;
              auVar191._12_4_ = fVar174;
              auVar73 = vfmadd132ps_fma(auVar191,auVar210,local_660._0_16_);
              fVar174 = auVar78._0_4_ * 6.0;
              auVar164._4_4_ = fVar174;
              auVar164._0_4_ = fVar174;
              auVar164._8_4_ = fVar174;
              auVar164._12_4_ = fVar174;
              auVar73 = vfmadd132ps_fma(auVar164,auVar73,local_680._0_16_);
              fVar174 = local_580._0_4_ * 6.0;
              auVar192._4_4_ = fVar174;
              auVar192._0_4_ = fVar174;
              auVar192._8_4_ = fVar174;
              auVar192._12_4_ = fVar174;
              auVar73 = vfmadd132ps_fma(auVar192,auVar73,local_640._0_16_);
              auVar165._0_4_ = auVar73._0_4_ * (float)local_5c0._0_4_;
              auVar165._4_4_ = auVar73._4_4_ * (float)local_5c0._0_4_;
              auVar165._8_4_ = auVar73._8_4_ * (float)local_5c0._0_4_;
              auVar165._12_4_ = auVar73._12_4_ * (float)local_5c0._0_4_;
              auVar73 = vdpps_avx(auVar74,auVar73,0x7f);
              fVar174 = auVar73._0_4_;
              auVar193._0_4_ = auVar74._0_4_ * fVar174;
              auVar193._4_4_ = auVar74._4_4_ * fVar174;
              auVar193._8_4_ = auVar74._8_4_ * fVar174;
              auVar193._12_4_ = auVar74._12_4_ * fVar174;
              auVar73 = vsubps_avx(auVar165,auVar193);
              fVar174 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar78 = vmaxss_avx(ZEXT416((uint)fVar157),
                                   ZEXT416((uint)(local_780._0_4_ * fVar170 * 1.9073486e-06)));
              auVar194._0_4_ = auVar73._0_4_ * fVar174;
              auVar194._4_4_ = auVar73._4_4_ * fVar174;
              auVar194._8_4_ = auVar73._8_4_ * fVar174;
              auVar194._12_4_ = auVar73._12_4_ * fVar174;
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar74,auVar28);
              auVar82 = vmulps_avx512vl(auVar71,auVar194);
              auVar73 = vdpps_avx(auVar81,auVar75,0x7f);
              auVar71 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar157),auVar78);
              auVar70 = vdpps_avx(auVar1,auVar82,0x7f);
              vfmadd213ss_avx512f(auVar77,ZEXT416((uint)(fVar157 / fVar173)),auVar71);
              fVar174 = auVar73._0_4_ + auVar70._0_4_;
              auVar70 = vdpps_avx(local_7b0,auVar75,0x7f);
              auVar73 = vdpps_avx(auVar1,auVar81,0x7f);
              auVar71 = vmulss_avx512f(auVar80,auVar76);
              auVar76 = vmulss_avx512f(auVar76,auVar76);
              auVar77 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar71._0_4_ * auVar76._0_4_)));
              auVar71 = vdpps_avx(auVar1,local_7b0,0x7f);
              auVar79 = vfnmadd231ss_avx512f(auVar73,local_7e0._0_16_,ZEXT416((uint)fVar174));
              auVar71 = vfnmadd231ss_avx512f(auVar71,local_7e0._0_16_,auVar70);
              auVar73 = vpermilps_avx(local_560._0_16_,0xff);
              fVar172 = fVar172 - auVar73._0_4_;
              auVar76 = vshufps_avx(auVar74,auVar74,0xff);
              auVar73 = vfmsub213ss_fma(auVar79,auVar77,auVar76);
              auVar239._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar73._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar73._12_4_ ^ 0x80000000;
              auVar71 = ZEXT416((uint)(auVar71._0_4_ * auVar77._0_4_));
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar174),auVar71);
              auVar73 = vinsertps_avx(auVar239,auVar71,0x1c);
              auVar229._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar70._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar174),auVar229,0x10);
              auVar211._0_4_ = auVar77._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar70 = vdivps_avx(auVar73,auVar211);
              auVar73 = vdivps_avx(auVar71,auVar211);
              auVar71 = vbroadcastss_avx512vl(local_7e0._0_16_);
              auVar212._0_4_ = auVar71._0_4_ * auVar70._0_4_ + fVar172 * auVar73._0_4_;
              auVar212._4_4_ = auVar71._4_4_ * auVar70._4_4_ + fVar172 * auVar73._4_4_;
              auVar212._8_4_ = auVar71._8_4_ * auVar70._8_4_ + fVar172 * auVar73._8_4_;
              auVar212._12_4_ = auVar71._12_4_ * auVar70._12_4_ + fVar172 * auVar73._12_4_;
              auVar70 = vsubps_avx(local_780._0_16_,auVar212);
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(local_7e0._0_16_,auVar29);
              auVar73 = vucomiss_avx512f(auVar73);
              if (!(bool)uVar65 && !(bool)uVar67) {
                auVar73 = vaddss_avx512f(auVar78,auVar73);
                auVar73 = vfmadd231ss_fma(auVar73,local_720,ZEXT416(0x36000000));
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar71 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar30);
                if (auVar71._0_4_ < auVar73._0_4_) {
                  fVar170 = auVar70._0_4_ + (float)local_730._0_4_;
                  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar203 <= fVar170) {
                    fVar172 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar172 < fVar170) {
                      bVar63 = 0;
                      goto LAB_01ce4392;
                    }
                    auVar73 = vmovshdup_avx(auVar70);
                    bVar63 = 0;
                    if ((auVar73._0_4_ < 0.0) || (1.0 < auVar73._0_4_)) goto LAB_01ce4392;
                    auVar213._0_12_ = ZEXT812(0);
                    auVar213._12_4_ = 0;
                    auVar195._4_8_ = auVar213._4_8_;
                    auVar195._0_4_ = fVar171;
                    auVar195._12_4_ = 0;
                    auVar73 = vrsqrt14ss_avx512f(auVar213,auVar195);
                    fVar174 = auVar73._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar64].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar63 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01ce4392;
                      fVar171 = fVar174 * 1.5 + fVar171 * -0.5 * fVar174 * fVar174 * fVar174;
                      auVar196._0_4_ = auVar1._0_4_ * fVar171;
                      auVar196._4_4_ = auVar1._4_4_ * fVar171;
                      auVar196._8_4_ = auVar1._8_4_ * fVar171;
                      auVar196._12_4_ = auVar1._12_4_ * fVar171;
                      auVar71 = vfmadd213ps_fma(auVar76,auVar196,auVar74);
                      auVar73 = vshufps_avx(auVar196,auVar196,0xc9);
                      auVar1 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar197._0_4_ = auVar196._0_4_ * auVar1._0_4_;
                      auVar197._4_4_ = auVar196._4_4_ * auVar1._4_4_;
                      auVar197._8_4_ = auVar196._8_4_ * auVar1._8_4_;
                      auVar197._12_4_ = auVar196._12_4_ * auVar1._12_4_;
                      auVar74 = vfmsub231ps_fma(auVar197,auVar74,auVar73);
                      auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar1 = vshufps_avx(auVar71,auVar71,0xc9);
                      auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                      auVar150._0_4_ = auVar71._0_4_ * auVar74._0_4_;
                      auVar150._4_4_ = auVar71._4_4_ * auVar74._4_4_;
                      auVar150._8_4_ = auVar71._8_4_ * auVar74._8_4_;
                      auVar150._12_4_ = auVar71._12_4_ * auVar74._12_4_;
                      auVar73 = vfmsub231ps_fma(auVar150,auVar73,auVar1);
                      auVar216._8_4_ = 1;
                      auVar216._0_8_ = 0x100000001;
                      auVar216._12_4_ = 1;
                      auVar216._16_4_ = 1;
                      auVar216._20_4_ = 1;
                      auVar216._24_4_ = 1;
                      auVar216._28_4_ = 1;
                      local_3e0 = vpermps_avx2(auVar216,ZEXT1632(auVar70));
                      auVar83 = vpermps_avx2(auVar216,ZEXT1632(auVar73));
                      auVar224._8_4_ = 2;
                      auVar224._0_8_ = 0x200000002;
                      auVar224._12_4_ = 2;
                      auVar224._16_4_ = 2;
                      auVar224._20_4_ = 2;
                      auVar224._24_4_ = 2;
                      auVar224._28_4_ = 2;
                      local_420 = vpermps_avx2(auVar224,ZEXT1632(auVar73));
                      local_400 = auVar73._0_4_;
                      local_440[0] = (RTCHitN)auVar83[0];
                      local_440[1] = (RTCHitN)auVar83[1];
                      local_440[2] = (RTCHitN)auVar83[2];
                      local_440[3] = (RTCHitN)auVar83[3];
                      local_440[4] = (RTCHitN)auVar83[4];
                      local_440[5] = (RTCHitN)auVar83[5];
                      local_440[6] = (RTCHitN)auVar83[6];
                      local_440[7] = (RTCHitN)auVar83[7];
                      local_440[8] = (RTCHitN)auVar83[8];
                      local_440[9] = (RTCHitN)auVar83[9];
                      local_440[10] = (RTCHitN)auVar83[10];
                      local_440[0xb] = (RTCHitN)auVar83[0xb];
                      local_440[0xc] = (RTCHitN)auVar83[0xc];
                      local_440[0xd] = (RTCHitN)auVar83[0xd];
                      local_440[0xe] = (RTCHitN)auVar83[0xe];
                      local_440[0xf] = (RTCHitN)auVar83[0xf];
                      local_440[0x10] = (RTCHitN)auVar83[0x10];
                      local_440[0x11] = (RTCHitN)auVar83[0x11];
                      local_440[0x12] = (RTCHitN)auVar83[0x12];
                      local_440[0x13] = (RTCHitN)auVar83[0x13];
                      local_440[0x14] = (RTCHitN)auVar83[0x14];
                      local_440[0x15] = (RTCHitN)auVar83[0x15];
                      local_440[0x16] = (RTCHitN)auVar83[0x16];
                      local_440[0x17] = (RTCHitN)auVar83[0x17];
                      local_440[0x18] = (RTCHitN)auVar83[0x18];
                      local_440[0x19] = (RTCHitN)auVar83[0x19];
                      local_440[0x1a] = (RTCHitN)auVar83[0x1a];
                      local_440[0x1b] = (RTCHitN)auVar83[0x1b];
                      local_440[0x1c] = (RTCHitN)auVar83[0x1c];
                      local_440[0x1d] = (RTCHitN)auVar83[0x1d];
                      local_440[0x1e] = (RTCHitN)auVar83[0x1e];
                      local_440[0x1f] = (RTCHitN)auVar83[0x1f];
                      uStack_3fc = local_400;
                      uStack_3f8 = local_400;
                      uStack_3f4 = local_400;
                      uStack_3f0 = local_400;
                      uStack_3ec = local_400;
                      uStack_3e8 = local_400;
                      uStack_3e4 = local_400;
                      local_3c0 = ZEXT432(0) << 0x20;
                      local_3a0 = local_460._0_8_;
                      uStack_398 = local_460._8_8_;
                      uStack_390 = local_460._16_8_;
                      uStack_388 = local_460._24_8_;
                      local_380 = local_480;
                      vpcmpeqd_avx2(local_480,local_480);
                      local_360 = context->user->instID[0];
                      uStack_35c = local_360;
                      uStack_358 = local_360;
                      uStack_354 = local_360;
                      uStack_350 = local_360;
                      uStack_34c = local_360;
                      uStack_348 = local_360;
                      uStack_344 = local_360;
                      local_340 = context->user->instPrimID[0];
                      uStack_33c = local_340;
                      uStack_338 = local_340;
                      uStack_334 = local_340;
                      uStack_330 = local_340;
                      uStack_32c = local_340;
                      uStack_328 = local_340;
                      uStack_324 = local_340;
                      *(float *)(ray + k * 4 + 0x100) = fVar170;
                      local_760 = local_4c0;
                      local_810.valid = (int *)local_760;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_440;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar248 = ZEXT1664(auVar75);
                        (*pGVar3->occlusionFilterN)(&local_810);
                        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      if (local_760 != (undefined1  [32])0x0) {
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar248 = ZEXT1664(auVar248._0_16_);
                          (*p_Var5)(&local_810);
                          auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        }
                        uVar68 = vptestmd_avx512vl(local_760,local_760);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar6 = (bool)((byte)uVar68 & 1);
                        bVar7 = (bool)((byte)(uVar68 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar68 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
                        bVar13 = SUB81(uVar68 >> 7,0);
                        *(uint *)(local_810.ray + 0x100) =
                             (uint)bVar6 * auVar83._0_4_ |
                             (uint)!bVar6 * *(int *)(local_810.ray + 0x100);
                        *(uint *)(local_810.ray + 0x104) =
                             (uint)bVar7 * auVar83._4_4_ |
                             (uint)!bVar7 * *(int *)(local_810.ray + 0x104);
                        *(uint *)(local_810.ray + 0x108) =
                             (uint)bVar8 * auVar83._8_4_ |
                             (uint)!bVar8 * *(int *)(local_810.ray + 0x108);
                        *(uint *)(local_810.ray + 0x10c) =
                             (uint)bVar9 * auVar83._12_4_ |
                             (uint)!bVar9 * *(int *)(local_810.ray + 0x10c);
                        *(uint *)(local_810.ray + 0x110) =
                             (uint)bVar10 * auVar83._16_4_ |
                             (uint)!bVar10 * *(int *)(local_810.ray + 0x110);
                        *(uint *)(local_810.ray + 0x114) =
                             (uint)bVar11 * auVar83._20_4_ |
                             (uint)!bVar11 * *(int *)(local_810.ray + 0x114);
                        *(uint *)(local_810.ray + 0x118) =
                             (uint)bVar12 * auVar83._24_4_ |
                             (uint)!bVar12 * *(int *)(local_810.ray + 0x118);
                        *(uint *)(local_810.ray + 0x11c) =
                             (uint)bVar13 * auVar83._28_4_ |
                             (uint)!bVar13 * *(int *)(local_810.ray + 0x11c);
                        bVar63 = 1;
                        if (local_760 != (undefined1  [32])0x0) goto LAB_01ce4392;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar172;
                      bVar63 = 0;
                      goto LAB_01ce4392;
                    }
                  }
                  bVar63 = 0;
                  goto LAB_01ce4392;
                }
              }
              bVar66 = uVar68 < 4;
              uVar68 = uVar68 + 1;
            } while (uVar68 != 5);
            bVar66 = false;
            auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar63 = 5;
LAB_01ce4392:
            bVar62 = (bool)(bVar62 | bVar66 & bVar63);
            uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar154._4_4_ = uVar158;
            auVar154._0_4_ = uVar158;
            auVar154._8_4_ = uVar158;
            auVar154._12_4_ = uVar158;
            auVar154._16_4_ = uVar158;
            auVar154._20_4_ = uVar158;
            auVar154._24_4_ = uVar158;
            auVar154._28_4_ = uVar158;
            auVar51._4_4_ = fStack_4dc;
            auVar51._0_4_ = local_4e0;
            auVar51._8_4_ = fStack_4d8;
            auVar51._12_4_ = fStack_4d4;
            auVar51._16_4_ = fStack_4d0;
            auVar51._20_4_ = fStack_4cc;
            auVar51._24_4_ = fStack_4c8;
            auVar51._28_4_ = fStack_4c4;
            uVar17 = vcmpps_avx512vl(auVar154,auVar51,0xd);
            bVar55 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar55 & (byte)uVar17;
            auVar133 = local_500;
          } while (bVar55 != 0);
        }
        auVar225 = ZEXT3264(local_6c0);
        uVar18 = vpcmpgtd_avx512vl(auVar133,local_4a0);
        uVar19 = vpcmpd_avx512vl(local_4a0,local_2c0,1);
        auVar200._0_4_ = fVar143 + (float)local_1c0._0_4_;
        auVar200._4_4_ = fVar143 + (float)local_1c0._4_4_;
        auVar200._8_4_ = fVar143 + fStack_1b8;
        auVar200._12_4_ = fVar143 + fStack_1b4;
        auVar200._16_4_ = fVar143 + fStack_1b0;
        auVar200._20_4_ = fVar143 + fStack_1ac;
        auVar200._24_4_ = fVar143 + fStack_1a8;
        auVar200._28_4_ = fVar143 + fStack_1a4;
        uVar17 = vcmpps_avx512vl(auVar200,auVar154,2);
        bVar61 = bVar61 & (byte)uVar19 & (byte)uVar17;
        auVar201._0_4_ = fVar143 + local_320._0_4_;
        auVar201._4_4_ = fVar143 + local_320._4_4_;
        auVar201._8_4_ = fVar143 + local_320._8_4_;
        auVar201._12_4_ = fVar143 + local_320._12_4_;
        auVar201._16_4_ = fVar143 + local_320._16_4_;
        auVar201._20_4_ = fVar143 + local_320._20_4_;
        auVar201._24_4_ = fVar143 + local_320._24_4_;
        auVar201._28_4_ = fVar143 + local_320._28_4_;
        uVar17 = vcmpps_avx512vl(auVar201,auVar154,2);
        bVar53 = bVar53 & (byte)uVar18 & (byte)uVar17 | bVar61;
        prim = local_6d0;
        if (bVar53 != 0) {
          abStack_180[uVar59 * 0x60] = bVar53;
          auVar135._0_4_ =
               (uint)(bVar61 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar61 & 1) * (int)local_320._0_4_;
          bVar66 = (bool)(bVar61 >> 1 & 1);
          auVar135._4_4_ = (uint)bVar66 * local_1c0._4_4_ | (uint)!bVar66 * (int)local_320._4_4_;
          bVar66 = (bool)(bVar61 >> 2 & 1);
          auVar135._8_4_ = (uint)bVar66 * (int)fStack_1b8 | (uint)!bVar66 * (int)local_320._8_4_;
          bVar66 = (bool)(bVar61 >> 3 & 1);
          auVar135._12_4_ = (uint)bVar66 * (int)fStack_1b4 | (uint)!bVar66 * (int)local_320._12_4_;
          bVar66 = (bool)(bVar61 >> 4 & 1);
          auVar135._16_4_ = (uint)bVar66 * (int)fStack_1b0 | (uint)!bVar66 * (int)local_320._16_4_;
          bVar66 = (bool)(bVar61 >> 5 & 1);
          auVar135._20_4_ = (uint)bVar66 * (int)fStack_1ac | (uint)!bVar66 * (int)local_320._20_4_;
          auVar135._24_4_ =
               (uint)(bVar61 >> 6) * (int)fStack_1a8 |
               (uint)!(bool)(bVar61 >> 6) * (int)local_320._24_4_;
          auVar135._28_4_ = local_320._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar59 * 0x60) = auVar135;
          uVar68 = vmovlps_avx(local_740);
          (&uStack_140)[uVar59 * 0xc] = uVar68;
          aiStack_138[uVar59 * 0x18] = local_ab4 + 1;
          uVar59 = (ulong)((int)uVar59 + 1);
        }
      }
    }
    do {
      uVar69 = (uint)uVar59;
      uVar59 = (ulong)(uVar69 - 1);
      if (uVar69 == 0) {
        if (bVar62 != false) {
          return bVar62;
        }
        uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar36._4_4_ = uVar158;
        auVar36._0_4_ = uVar158;
        auVar36._8_4_ = uVar158;
        auVar36._12_4_ = uVar158;
        auVar36._16_4_ = uVar158;
        auVar36._20_4_ = uVar158;
        auVar36._24_4_ = uVar158;
        auVar36._28_4_ = uVar158;
        uVar17 = vcmpps_avx512vl(local_2a0,auVar36,2);
        uVar64 = (uint)uVar17 & (uint)local_6c8 - 1 & (uint)local_6c8;
        local_6c8 = (ulong)uVar64;
        if (uVar64 == 0) {
          return false;
        }
        goto LAB_01ce2082;
      }
      lVar60 = uVar59 * 0x60;
      auVar83 = *(undefined1 (*) [32])(auStack_160 + lVar60);
      auVar166._0_4_ = fVar143 + auVar83._0_4_;
      auVar166._4_4_ = fVar143 + auVar83._4_4_;
      auVar166._8_4_ = fVar143 + auVar83._8_4_;
      auVar166._12_4_ = fVar143 + auVar83._12_4_;
      auVar166._16_4_ = fVar143 + auVar83._16_4_;
      auVar166._20_4_ = fVar143 + auVar83._20_4_;
      auVar166._24_4_ = fVar143 + auVar83._24_4_;
      auVar166._28_4_ = fVar143 + auVar83._28_4_;
      uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar158;
      auVar35._0_4_ = uVar158;
      auVar35._8_4_ = uVar158;
      auVar35._12_4_ = uVar158;
      auVar35._16_4_ = uVar158;
      auVar35._20_4_ = uVar158;
      auVar35._24_4_ = uVar158;
      auVar35._28_4_ = uVar158;
      uVar17 = vcmpps_avx512vl(auVar166,auVar35,2);
      uVar57 = (uint)uVar17 & (uint)abStack_180[lVar60];
    } while (uVar57 == 0);
    uVar68 = (&uStack_140)[uVar59 * 0xc];
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar68;
    auVar199._8_4_ = 0x7f800000;
    auVar199._0_8_ = 0x7f8000007f800000;
    auVar199._12_4_ = 0x7f800000;
    auVar199._16_4_ = 0x7f800000;
    auVar199._20_4_ = 0x7f800000;
    auVar199._24_4_ = 0x7f800000;
    auVar199._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar199,auVar83);
    bVar53 = (byte)uVar57;
    auVar131._0_4_ =
         (uint)(bVar53 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)auVar83._0_4_;
    bVar66 = (bool)((byte)(uVar57 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar66 * auVar84._4_4_ | (uint)!bVar66 * (int)auVar83._4_4_;
    bVar66 = (bool)((byte)(uVar57 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar66 * auVar84._8_4_ | (uint)!bVar66 * (int)auVar83._8_4_;
    bVar66 = (bool)((byte)(uVar57 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar66 * auVar84._12_4_ | (uint)!bVar66 * (int)auVar83._12_4_;
    bVar66 = (bool)((byte)(uVar57 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar66 * auVar84._16_4_ | (uint)!bVar66 * (int)auVar83._16_4_;
    bVar66 = (bool)((byte)(uVar57 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar66 * auVar84._20_4_ | (uint)!bVar66 * (int)auVar83._20_4_;
    bVar66 = (bool)((byte)(uVar57 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar66 * auVar84._24_4_ | (uint)!bVar66 * (int)auVar83._24_4_;
    auVar131._28_4_ =
         (uVar57 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar57 >> 7,0) * (int)auVar83._28_4_;
    auVar83 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar83 = vminps_avx(auVar131,auVar83);
    auVar84 = vshufpd_avx(auVar83,auVar83,5);
    auVar83 = vminps_avx(auVar83,auVar84);
    auVar84 = vpermpd_avx2(auVar83,0x4e);
    auVar83 = vminps_avx(auVar83,auVar84);
    uVar17 = vcmpps_avx512vl(auVar131,auVar83,0);
    bVar55 = (byte)uVar17 & bVar53;
    if (bVar55 != 0) {
      uVar57 = (uint)bVar55;
    }
    uVar136 = 0;
    for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_ab4 = aiStack_138[uVar59 * 0x18];
    bVar53 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar53;
    abStack_180[lVar60] = bVar53;
    if (bVar53 == 0) {
      uVar69 = uVar69 - 1;
    }
    uVar158 = (undefined4)uVar68;
    auVar151._4_4_ = uVar158;
    auVar151._0_4_ = uVar158;
    auVar151._8_4_ = uVar158;
    auVar151._12_4_ = uVar158;
    auVar151._16_4_ = uVar158;
    auVar151._20_4_ = uVar158;
    auVar151._24_4_ = uVar158;
    auVar151._28_4_ = uVar158;
    auVar70 = vmovshdup_avx(auVar159);
    auVar70 = vsubps_avx(auVar70,auVar159);
    auVar167._0_4_ = auVar70._0_4_;
    auVar167._4_4_ = auVar167._0_4_;
    auVar167._8_4_ = auVar167._0_4_;
    auVar167._12_4_ = auVar167._0_4_;
    auVar167._16_4_ = auVar167._0_4_;
    auVar167._20_4_ = auVar167._0_4_;
    auVar167._24_4_ = auVar167._0_4_;
    auVar167._28_4_ = auVar167._0_4_;
    auVar70 = vfmadd132ps_fma(auVar167,auVar151,_DAT_01faff20);
    auVar83 = ZEXT1632(auVar70);
    local_440[0] = (RTCHitN)auVar83[0];
    local_440[1] = (RTCHitN)auVar83[1];
    local_440[2] = (RTCHitN)auVar83[2];
    local_440[3] = (RTCHitN)auVar83[3];
    local_440[4] = (RTCHitN)auVar83[4];
    local_440[5] = (RTCHitN)auVar83[5];
    local_440[6] = (RTCHitN)auVar83[6];
    local_440[7] = (RTCHitN)auVar83[7];
    local_440[8] = (RTCHitN)auVar83[8];
    local_440[9] = (RTCHitN)auVar83[9];
    local_440[10] = (RTCHitN)auVar83[10];
    local_440[0xb] = (RTCHitN)auVar83[0xb];
    local_440[0xc] = (RTCHitN)auVar83[0xc];
    local_440[0xd] = (RTCHitN)auVar83[0xd];
    local_440[0xe] = (RTCHitN)auVar83[0xe];
    local_440[0xf] = (RTCHitN)auVar83[0xf];
    local_440[0x10] = (RTCHitN)auVar83[0x10];
    local_440[0x11] = (RTCHitN)auVar83[0x11];
    local_440[0x12] = (RTCHitN)auVar83[0x12];
    local_440[0x13] = (RTCHitN)auVar83[0x13];
    local_440[0x14] = (RTCHitN)auVar83[0x14];
    local_440[0x15] = (RTCHitN)auVar83[0x15];
    local_440[0x16] = (RTCHitN)auVar83[0x16];
    local_440[0x17] = (RTCHitN)auVar83[0x17];
    local_440[0x18] = (RTCHitN)auVar83[0x18];
    local_440[0x19] = (RTCHitN)auVar83[0x19];
    local_440[0x1a] = (RTCHitN)auVar83[0x1a];
    local_440[0x1b] = (RTCHitN)auVar83[0x1b];
    local_440[0x1c] = (RTCHitN)auVar83[0x1c];
    local_440[0x1d] = (RTCHitN)auVar83[0x1d];
    local_440[0x1e] = (RTCHitN)auVar83[0x1e];
    local_440[0x1f] = (RTCHitN)auVar83[0x1f];
    local_740._8_8_ = 0;
    local_740._0_8_ = *(ulong *)(local_440 + (ulong)uVar136 * 4);
    uVar59 = (ulong)uVar69;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }